

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  int iVar7;
  __int_type_conflict _Var8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  byte bVar58;
  long lVar59;
  ulong uVar60;
  ulong uVar61;
  Geometry *pGVar62;
  uint uVar63;
  Geometry *geometry;
  long lVar64;
  ulong uVar65;
  byte bVar66;
  ulong uVar67;
  float fVar68;
  float fVar69;
  float fVar115;
  float fVar117;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar116;
  float fVar118;
  float fVar120;
  float fVar121;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar119;
  float fVar122;
  float fVar123;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined4 uVar124;
  float fVar133;
  float fVar134;
  vint4 bi_2;
  undefined1 auVar125 [16];
  float fVar135;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined8 uVar136;
  vint4 bi_1;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  vint4 bi;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 ai_2;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  vint4 ai_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar166;
  float fVar169;
  vint4 ai;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [16];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  undefined1 local_600 [16];
  ulong local_5e8;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  Geometry *local_5c0;
  Precalculations *local_5b8;
  RTCFilterFunctionNArguments local_5b0;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  LinearSpace3fa *local_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_310 [16];
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  uint local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar60 = (ulong)(byte)PVar6;
  lVar24 = uVar60 * 0x25;
  fVar148 = *(float *)(prim + lVar24 + 0x12);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar74 = vsubps_avx(auVar74,*(undefined1 (*) [16])(prim + lVar24 + 6));
  auVar149._0_4_ = fVar148 * auVar74._0_4_;
  auVar149._4_4_ = fVar148 * auVar74._4_4_;
  auVar149._8_4_ = fVar148 * auVar74._8_4_;
  auVar149._12_4_ = fVar148 * auVar74._12_4_;
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar125._0_4_ = fVar148 * auVar73._0_4_;
  auVar125._4_4_ = fVar148 * auVar73._4_4_;
  auVar125._8_4_ = fVar148 * auVar73._8_4_;
  auVar125._12_4_ = fVar148 * auVar73._12_4_;
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar193 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xf + 6)));
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar60 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1a + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1c + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar161._4_4_ = auVar125._0_4_;
  auVar161._0_4_ = auVar125._0_4_;
  auVar161._8_4_ = auVar125._0_4_;
  auVar161._12_4_ = auVar125._0_4_;
  auVar75 = vshufps_avx(auVar125,auVar125,0x55);
  auVar76 = vshufps_avx(auVar125,auVar125,0xaa);
  fVar148 = auVar76._0_4_;
  auVar143._0_4_ = fVar148 * auVar193._0_4_;
  fVar133 = auVar76._4_4_;
  auVar143._4_4_ = fVar133 * auVar193._4_4_;
  fVar134 = auVar76._8_4_;
  auVar143._8_4_ = fVar134 * auVar193._8_4_;
  fVar135 = auVar76._12_4_;
  auVar143._12_4_ = fVar135 * auVar193._12_4_;
  auVar137._0_4_ = auVar19._0_4_ * fVar148;
  auVar137._4_4_ = auVar19._4_4_ * fVar133;
  auVar137._8_4_ = auVar19._8_4_ * fVar134;
  auVar137._12_4_ = auVar19._12_4_ * fVar135;
  auVar126._0_4_ = auVar22._0_4_ * fVar148;
  auVar126._4_4_ = auVar22._4_4_ * fVar133;
  auVar126._8_4_ = auVar22._8_4_ * fVar134;
  auVar126._12_4_ = auVar22._12_4_ * fVar135;
  auVar76 = vfmadd231ps_fma(auVar143,auVar75,auVar73);
  auVar26 = vfmadd231ps_fma(auVar137,auVar75,auVar18);
  auVar75 = vfmadd231ps_fma(auVar126,auVar21,auVar75);
  auVar27 = vfmadd231ps_fma(auVar76,auVar161,auVar74);
  auVar26 = vfmadd231ps_fma(auVar26,auVar161,auVar17);
  auVar77 = vfmadd231ps_fma(auVar75,auVar20,auVar161);
  auVar182._4_4_ = auVar149._0_4_;
  auVar182._0_4_ = auVar149._0_4_;
  auVar182._8_4_ = auVar149._0_4_;
  auVar182._12_4_ = auVar149._0_4_;
  auVar75 = vshufps_avx(auVar149,auVar149,0x55);
  auVar76 = vshufps_avx(auVar149,auVar149,0xaa);
  fVar148 = auVar76._0_4_;
  auVar162._0_4_ = fVar148 * auVar193._0_4_;
  fVar133 = auVar76._4_4_;
  auVar162._4_4_ = fVar133 * auVar193._4_4_;
  fVar134 = auVar76._8_4_;
  auVar162._8_4_ = fVar134 * auVar193._8_4_;
  fVar135 = auVar76._12_4_;
  auVar162._12_4_ = fVar135 * auVar193._12_4_;
  auVar155._0_4_ = auVar19._0_4_ * fVar148;
  auVar155._4_4_ = auVar19._4_4_ * fVar133;
  auVar155._8_4_ = auVar19._8_4_ * fVar134;
  auVar155._12_4_ = auVar19._12_4_ * fVar135;
  auVar150._0_4_ = auVar22._0_4_ * fVar148;
  auVar150._4_4_ = auVar22._4_4_ * fVar133;
  auVar150._8_4_ = auVar22._8_4_ * fVar134;
  auVar150._12_4_ = auVar22._12_4_ * fVar135;
  auVar73 = vfmadd231ps_fma(auVar162,auVar75,auVar73);
  auVar193 = vfmadd231ps_fma(auVar155,auVar75,auVar18);
  auVar18 = vfmadd231ps_fma(auVar150,auVar75,auVar21);
  auVar28 = vfmadd231ps_fma(auVar73,auVar182,auVar74);
  auVar125 = vfmadd231ps_fma(auVar193,auVar182,auVar17);
  auVar173._8_4_ = 0x7fffffff;
  auVar173._0_8_ = 0x7fffffff7fffffff;
  auVar173._12_4_ = 0x7fffffff;
  auVar126 = vfmadd231ps_fma(auVar18,auVar182,auVar20);
  auVar74 = vandps_avx(auVar173,auVar27);
  auVar170._8_4_ = 0x219392ef;
  auVar170._0_8_ = 0x219392ef219392ef;
  auVar170._12_4_ = 0x219392ef;
  uVar65 = vcmpps_avx512vl(auVar74,auVar170,1);
  bVar11 = (bool)((byte)uVar65 & 1);
  auVar70._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar27._0_4_;
  bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar27._4_4_;
  bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar27._8_4_;
  bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar27._12_4_;
  auVar74 = vandps_avx(auVar173,auVar26);
  uVar65 = vcmpps_avx512vl(auVar74,auVar170,1);
  bVar11 = (bool)((byte)uVar65 & 1);
  auVar71._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar26._0_4_;
  bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar26._4_4_;
  bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar26._8_4_;
  bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar26._12_4_;
  auVar74 = vandps_avx(auVar173,auVar77);
  uVar65 = vcmpps_avx512vl(auVar74,auVar170,1);
  bVar11 = (bool)((byte)uVar65 & 1);
  auVar72._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._0_4_;
  bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._4_4_;
  bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._8_4_;
  bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._12_4_;
  auVar73 = vrcp14ps_avx512vl(auVar70);
  auVar171._8_4_ = 0x3f800000;
  auVar171._0_8_ = 0x3f8000003f800000;
  auVar171._12_4_ = 0x3f800000;
  auVar74 = vfnmadd213ps_fma(auVar70,auVar73,auVar171);
  auVar27 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar71);
  auVar74 = vfnmadd213ps_fma(auVar71,auVar73,auVar171);
  auVar77 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar72);
  auVar74 = vfnmadd213ps_fma(auVar72,auVar73,auVar171);
  auVar25 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
  fVar148 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  auVar167._4_4_ = fVar148;
  auVar167._0_4_ = fVar148;
  auVar167._8_4_ = fVar148;
  auVar167._12_4_ = fVar148;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar74 = vpmovsxwd_avx(auVar74);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar73 = vpmovsxwd_avx(auVar73);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar17 = vsubps_avx(auVar73,auVar74);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar73 = vpmovsxwd_avx(auVar193);
  auVar193 = vfmadd213ps_fma(auVar17,auVar167,auVar74);
  auVar74 = vcvtdq2ps_avx(auVar73);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar73 = vpmovsxwd_avx(auVar17);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar17 = vfmadd213ps_fma(auVar73,auVar167,auVar74);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar74 = vpmovsxwd_avx(auVar18);
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar65 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar60 * 2 + uVar65 + 6);
  auVar73 = vpmovsxwd_avx(auVar19);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar18 = vfmadd213ps_fma(auVar73,auVar167,auVar74);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar65 + 6);
  auVar74 = vpmovsxwd_avx(auVar20);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar60 * 0x18 + 6);
  auVar73 = vpmovsxwd_avx(auVar21);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar19 = vfmadd213ps_fma(auVar73,auVar167,auVar74);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar60 * 0x1d + 6);
  auVar74 = vpmovsxwd_avx(auVar22);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar60 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar73 = vpmovsxwd_avx(auVar75);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar20 = vfmadd213ps_fma(auVar73,auVar167,auVar74);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar60) + 6);
  auVar74 = vpmovsxwd_avx(auVar76);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar60 * 0x23 + 6);
  auVar73 = vpmovsxwd_avx(auVar26);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar73 = vfmadd213ps_fma(auVar73,auVar167,auVar74);
  auVar74 = vsubps_avx(auVar193,auVar28);
  auVar168._0_4_ = auVar27._0_4_ * auVar74._0_4_;
  auVar168._4_4_ = auVar27._4_4_ * auVar74._4_4_;
  auVar168._8_4_ = auVar27._8_4_ * auVar74._8_4_;
  auVar168._12_4_ = auVar27._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar17,auVar28);
  auVar144._0_4_ = auVar27._0_4_ * auVar74._0_4_;
  auVar144._4_4_ = auVar27._4_4_ * auVar74._4_4_;
  auVar144._8_4_ = auVar27._8_4_ * auVar74._8_4_;
  auVar144._12_4_ = auVar27._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar18,auVar125);
  auVar163._0_4_ = auVar77._0_4_ * auVar74._0_4_;
  auVar163._4_4_ = auVar77._4_4_ * auVar74._4_4_;
  auVar163._8_4_ = auVar77._8_4_ * auVar74._8_4_;
  auVar163._12_4_ = auVar77._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar19,auVar125);
  auVar138._0_4_ = auVar77._0_4_ * auVar74._0_4_;
  auVar138._4_4_ = auVar77._4_4_ * auVar74._4_4_;
  auVar138._8_4_ = auVar77._8_4_ * auVar74._8_4_;
  auVar138._12_4_ = auVar77._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar20,auVar126);
  auVar156._0_4_ = auVar25._0_4_ * auVar74._0_4_;
  auVar156._4_4_ = auVar25._4_4_ * auVar74._4_4_;
  auVar156._8_4_ = auVar25._8_4_ * auVar74._8_4_;
  auVar156._12_4_ = auVar25._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar73,auVar126);
  auVar127._0_4_ = auVar25._0_4_ * auVar74._0_4_;
  auVar127._4_4_ = auVar25._4_4_ * auVar74._4_4_;
  auVar127._8_4_ = auVar25._8_4_ * auVar74._8_4_;
  auVar127._12_4_ = auVar25._12_4_ * auVar74._12_4_;
  auVar74 = vpminsd_avx(auVar168,auVar144);
  auVar73 = vpminsd_avx(auVar163,auVar138);
  auVar74 = vmaxps_avx(auVar74,auVar73);
  auVar73 = vpminsd_avx(auVar156,auVar127);
  uVar124 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar27._4_4_ = uVar124;
  auVar27._0_4_ = uVar124;
  auVar27._8_4_ = uVar124;
  auVar27._12_4_ = uVar124;
  auVar73 = vmaxps_avx512vl(auVar73,auVar27);
  auVar74 = vmaxps_avx(auVar74,auVar73);
  auVar77._8_4_ = 0x3f7ffffa;
  auVar77._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar77._12_4_ = 0x3f7ffffa;
  local_290 = vmulps_avx512vl(auVar74,auVar77);
  auVar74 = vpmaxsd_avx(auVar168,auVar144);
  auVar73 = vpmaxsd_avx(auVar163,auVar138);
  auVar74 = vminps_avx(auVar74,auVar73);
  auVar73 = vpmaxsd_avx(auVar156,auVar127);
  uVar124 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar25._4_4_ = uVar124;
  auVar25._0_4_ = uVar124;
  auVar25._8_4_ = uVar124;
  auVar25._12_4_ = uVar124;
  auVar73 = vminps_avx512vl(auVar73,auVar25);
  auVar74 = vminps_avx(auVar74,auVar73);
  auVar28._8_4_ = 0x3f800003;
  auVar28._0_8_ = 0x3f8000033f800003;
  auVar28._12_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar28);
  auVar73 = vpbroadcastd_avx512vl();
  uVar136 = vcmpps_avx512vl(local_290,auVar74,2);
  uVar65 = vpcmpgtd_avx512vl(auVar73,_DAT_01f7fcf0);
  uVar65 = ((byte)uVar136 & 0xf) & uVar65;
  if ((char)uVar65 == '\0') {
    bVar66 = 0;
  }
  else {
    local_528 = pre->ray_space + k;
    local_3c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_5b8 = pre;
    do {
      lVar24 = 0;
      for (uVar60 = uVar65; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      local_5e8 = (ulong)*(uint *)(prim + 2);
      pGVar62 = (context->scene->geometries).items[local_5e8].ptr;
      local_570._0_8_ = CONCAT44(0,*(uint *)(prim + lVar24 * 4 + 6));
      uVar67 = (ulong)*(uint *)(*(long *)&pGVar62->field_0x58 +
                               CONCAT44(0,*(uint *)(prim + lVar24 * 4 + 6)) *
                               pGVar62[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar148 = (pGVar62->time_range).lower;
      fVar148 = pGVar62->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar148) /
                ((pGVar62->time_range).upper - fVar148));
      auVar74 = vroundss_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),9);
      auVar74 = vminss_avx(auVar74,ZEXT416((uint)(pGVar62->fnumTimeSegments + -1.0)));
      auVar74 = vmaxss_avx(ZEXT816(0) << 0x20,auVar74);
      fVar148 = fVar148 - auVar74._0_4_;
      fVar133 = 1.0 - fVar148;
      _Var8 = pGVar62[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar59 = (long)(int)auVar74._0_4_ * 0x38;
      lVar24 = *(long *)(_Var8 + 0x10 + lVar59);
      lVar64 = *(long *)(_Var8 + 0x38 + lVar59);
      lVar9 = *(long *)(_Var8 + 0x48 + lVar59);
      auVar128._4_4_ = fVar148;
      auVar128._0_4_ = fVar148;
      auVar128._8_4_ = fVar148;
      auVar128._12_4_ = fVar148;
      pfVar3 = (float *)(lVar64 + lVar9 * uVar67);
      auVar174._0_4_ = fVar148 * *pfVar3;
      auVar174._4_4_ = fVar148 * pfVar3[1];
      auVar174._8_4_ = fVar148 * pfVar3[2];
      auVar174._12_4_ = fVar148 * pfVar3[3];
      uVar60 = uVar67 + 1;
      auVar74 = vmulps_avx512vl(auVar128,*(undefined1 (*) [16])(lVar64 + lVar9 * uVar60));
      p_Var10 = pGVar62[4].occlusionFilterN;
      auVar139._4_4_ = fVar133;
      auVar139._0_4_ = fVar133;
      auVar139._8_4_ = fVar133;
      auVar139._12_4_ = fVar133;
      local_540 = vfmadd231ps_fma(auVar174,auVar139,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var8 + lVar59) + lVar24 * uVar67));
      _local_3b0 = vfmadd231ps_avx512vl
                             (auVar74,auVar139,
                              *(undefined1 (*) [16])(*(long *)(_Var8 + lVar59) + lVar24 * uVar60));
      pfVar3 = (float *)(*(long *)(p_Var10 + lVar59 + 0x38) +
                        uVar67 * *(long *)(p_Var10 + lVar59 + 0x48));
      auVar175._0_4_ = fVar148 * *pfVar3;
      auVar175._4_4_ = fVar148 * pfVar3[1];
      auVar175._8_4_ = fVar148 * pfVar3[2];
      auVar175._12_4_ = fVar148 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var10 + lVar59 + 0x38) +
                        *(long *)(p_Var10 + lVar59 + 0x48) * uVar60);
      auVar178._0_4_ = fVar148 * *pfVar3;
      auVar178._4_4_ = fVar148 * pfVar3[1];
      auVar178._8_4_ = fVar148 * pfVar3[2];
      auVar178._12_4_ = fVar148 * pfVar3[3];
      auVar73 = vfmadd231ps_fma(auVar175,auVar139,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var10 + lVar59) +
                                 *(long *)(p_Var10 + lVar59 + 0x10) * uVar67));
      auVar193 = vfmadd231ps_fma(auVar178,auVar139,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var10 + lVar59) +
                                  *(long *)(p_Var10 + lVar59 + 0x10) * uVar60));
      iVar7 = (int)pGVar62[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      lVar24 = (long)iVar7 * 0x44;
      auVar140._8_4_ = 0xbeaaaaab;
      auVar140._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar140._12_4_ = 0xbeaaaaab;
      local_550 = vfnmadd213ps_fma(auVar73,auVar140,local_540);
      local_560 = vfmadd213ps_avx512vl(auVar193,auVar140,_local_3b0);
      auVar193 = vsubps_avx(local_540,auVar74);
      uVar124 = auVar193._0_4_;
      auVar145._4_4_ = uVar124;
      auVar145._0_4_ = uVar124;
      auVar145._8_4_ = uVar124;
      auVar145._12_4_ = uVar124;
      auVar73 = vshufps_avx(auVar193,auVar193,0x55);
      aVar4 = (local_528->vx).field_0;
      aVar5 = (local_528->vy).field_0;
      fVar148 = (local_528->vz).field_0.m128[0];
      fVar133 = *(float *)((long)&(local_528->vz).field_0 + 4);
      fVar134 = *(float *)((long)&(local_528->vz).field_0 + 8);
      fVar135 = *(float *)((long)&(local_528->vz).field_0 + 0xc);
      auVar193 = vshufps_avx(auVar193,auVar193,0xaa);
      auVar177._0_4_ = fVar148 * auVar193._0_4_;
      auVar177._4_4_ = fVar133 * auVar193._4_4_;
      auVar177._8_4_ = fVar134 * auVar193._8_4_;
      auVar177._12_4_ = fVar135 * auVar193._12_4_;
      auVar73 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar5,auVar73);
      auVar17 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar4,auVar145);
      auVar193 = vsubps_avx(local_550,auVar74);
      uVar124 = auVar193._0_4_;
      auVar146._4_4_ = uVar124;
      auVar146._0_4_ = uVar124;
      auVar146._8_4_ = uVar124;
      auVar146._12_4_ = uVar124;
      auVar73 = vshufps_avx(auVar193,auVar193,0x55);
      auVar193 = vshufps_avx(auVar193,auVar193,0xaa);
      auVar179._0_4_ = fVar148 * auVar193._0_4_;
      auVar179._4_4_ = fVar133 * auVar193._4_4_;
      auVar179._8_4_ = fVar134 * auVar193._8_4_;
      auVar179._12_4_ = fVar135 * auVar193._12_4_;
      auVar73 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar73);
      auVar18 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar4,auVar146);
      auVar193 = vsubps_avx(local_560,auVar74);
      uVar124 = auVar193._0_4_;
      auVar147._4_4_ = uVar124;
      auVar147._0_4_ = uVar124;
      auVar147._8_4_ = uVar124;
      auVar147._12_4_ = uVar124;
      auVar73 = vshufps_avx(auVar193,auVar193,0x55);
      auVar193 = vshufps_avx(auVar193,auVar193,0xaa);
      auVar180._0_4_ = fVar148 * auVar193._0_4_;
      auVar180._4_4_ = fVar133 * auVar193._4_4_;
      auVar180._8_4_ = fVar134 * auVar193._8_4_;
      auVar180._12_4_ = fVar135 * auVar193._12_4_;
      auVar73 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar5,auVar73);
      auVar193 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar4,auVar147);
      auVar73 = vsubps_avx512vl(_local_3b0,auVar74);
      uVar124 = auVar73._0_4_;
      auVar141._4_4_ = uVar124;
      auVar141._0_4_ = uVar124;
      auVar141._8_4_ = uVar124;
      auVar141._12_4_ = uVar124;
      auVar74 = vshufps_avx(auVar73,auVar73,0x55);
      auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar185._0_4_ = fVar148 * auVar73._0_4_;
      auVar185._4_4_ = fVar133 * auVar73._4_4_;
      auVar185._8_4_ = fVar134 * auVar73._8_4_;
      auVar185._12_4_ = fVar135 * auVar73._12_4_;
      auVar74 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar74);
      auVar19 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar4,auVar141);
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar24);
      uVar124 = auVar17._0_4_;
      local_480._4_4_ = uVar124;
      local_480._0_4_ = uVar124;
      local_480._8_4_ = uVar124;
      local_480._12_4_ = uVar124;
      local_480._16_4_ = uVar124;
      local_480._20_4_ = uVar124;
      local_480._24_4_ = uVar124;
      local_480._28_4_ = uVar124;
      auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x484);
      auVar78._8_4_ = 1;
      auVar78._0_8_ = 0x100000001;
      auVar78._12_4_ = 1;
      auVar78._16_4_ = 1;
      auVar78._20_4_ = 1;
      auVar78._24_4_ = 1;
      auVar78._28_4_ = 1;
      local_3e0 = vpermps_avx2(auVar78,ZEXT1632(auVar17));
      uVar124 = auVar18._0_4_;
      local_4a0._4_4_ = uVar124;
      local_4a0._0_4_ = uVar124;
      local_4a0._8_4_ = uVar124;
      local_4a0._12_4_ = uVar124;
      local_4a0._16_4_ = uVar124;
      local_4a0._20_4_ = uVar124;
      local_4a0._24_4_ = uVar124;
      local_4a0._28_4_ = uVar124;
      local_400 = vpermps_avx512vl(auVar78,ZEXT1632(auVar18));
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x908);
      local_4c0 = vbroadcastss_avx512vl(auVar193);
      local_4e0 = vpermps_avx512vl(auVar78,ZEXT1632(auVar193));
      auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0xd8c);
      uVar124 = auVar19._0_4_;
      local_420._4_4_ = uVar124;
      local_420._0_4_ = uVar124;
      local_420._8_4_ = uVar124;
      local_420._12_4_ = uVar124;
      local_420._16_4_ = uVar124;
      local_420._20_4_ = uVar124;
      local_420._24_4_ = uVar124;
      local_420._28_4_ = uVar124;
      local_440 = vpermps_avx512vl(auVar78,ZEXT1632(auVar19));
      auVar78 = vmulps_avx512vl(local_420,auVar90);
      auVar79 = vmulps_avx512vl(local_440,auVar90);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar91,local_4c0);
      auVar79 = vfmadd231ps_avx512vl(auVar79,auVar91,local_4e0);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar95,local_4a0);
      auVar80 = vfmadd231ps_avx512vl(auVar79,auVar95,local_400);
      auVar81 = vfmadd231ps_avx512vl(auVar78,auVar93,local_480);
      auVar78 = *(undefined1 (*) [32])(bezier_basis1 + lVar24);
      auVar79 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x484);
      auVar89 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x908);
      auVar82 = vfmadd231ps_avx512vl(auVar80,auVar93,local_3e0);
      auVar80 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0xd8c);
      auVar83 = vmulps_avx512vl(local_420,auVar80);
      auVar84 = vmulps_avx512vl(local_440,auVar80);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar89,local_4c0);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar89,local_4e0);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar79,local_4a0);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar79,local_400);
      auVar20 = vfmadd231ps_fma(auVar83,auVar78,local_480);
      auVar21 = vfmadd231ps_fma(auVar84,auVar78,local_3e0);
      auVar84 = vsubps_avx512vl(ZEXT1632(auVar20),auVar81);
      auVar85 = vsubps_avx512vl(ZEXT1632(auVar21),auVar82);
      auVar83 = vmulps_avx512vl(auVar82,auVar84);
      auVar86 = vmulps_avx512vl(auVar81,auVar85);
      auVar83 = vsubps_avx512vl(auVar83,auVar86);
      auVar74 = vshufps_avx(local_540,local_540,0xff);
      uVar136 = auVar74._0_8_;
      local_80._8_8_ = uVar136;
      local_80._0_8_ = uVar136;
      local_80._16_8_ = uVar136;
      local_80._24_8_ = uVar136;
      auVar74 = vshufps_avx(local_550,local_550,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar74);
      auVar74 = vshufps_avx(local_560,local_560,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar74);
      auVar74 = vshufps_avx512vl(_local_3b0,_local_3b0,0xff);
      uVar136 = auVar74._0_8_;
      register0x000012c8 = uVar136;
      local_e0 = uVar136;
      register0x000012d0 = uVar136;
      register0x000012d8 = uVar136;
      auVar86 = vmulps_avx512vl(_local_e0,auVar90);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar91,local_c0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar95,local_a0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar93,local_80);
      auVar87 = vmulps_avx512vl(_local_e0,auVar80);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,local_c0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar79,local_a0);
      auVar22 = vfmadd231ps_fma(auVar87,auVar78,local_80);
      auVar87 = vmulps_avx512vl(auVar85,auVar85);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar84);
      auVar88 = vmaxps_avx512vl(auVar86,ZEXT1632(auVar22));
      auVar88 = vmulps_avx512vl(auVar88,auVar88);
      auVar87 = vmulps_avx512vl(auVar88,auVar87);
      auVar83 = vmulps_avx512vl(auVar83,auVar83);
      uVar136 = vcmpps_avx512vl(auVar83,auVar87,2);
      auVar74 = vblendps_avx(auVar17,local_540,8);
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar73 = vandps_avx512vl(auVar74,auVar75);
      auVar74 = vblendps_avx(auVar18,local_550,8);
      auVar74 = vandps_avx512vl(auVar74,auVar75);
      auVar73 = vmaxps_avx(auVar73,auVar74);
      auVar74 = vblendps_avx(auVar193,local_560,8);
      auVar76 = vandps_avx512vl(auVar74,auVar75);
      auVar74 = vblendps_avx(auVar19,_local_3b0,8);
      auVar74 = vandps_avx512vl(auVar74,auVar75);
      auVar74 = vmaxps_avx(auVar76,auVar74);
      auVar74 = vmaxps_avx(auVar73,auVar74);
      auVar73 = vmovshdup_avx(auVar74);
      auVar73 = vmaxss_avx(auVar73,auVar74);
      auVar74 = vshufpd_avx(auVar74,auVar74,1);
      auVar74 = vmaxss_avx(auVar74,auVar73);
      local_580 = vcvtsi2ss_avx512f(_local_3b0,iVar7);
      auVar87._0_4_ = local_580._0_4_;
      auVar87._4_4_ = auVar87._0_4_;
      auVar87._8_4_ = auVar87._0_4_;
      auVar87._12_4_ = auVar87._0_4_;
      auVar87._16_4_ = auVar87._0_4_;
      auVar87._20_4_ = auVar87._0_4_;
      auVar87._24_4_ = auVar87._0_4_;
      auVar87._28_4_ = auVar87._0_4_;
      uVar23 = vcmpps_avx512vl(auVar87,_DAT_01faff40,0xe);
      bVar66 = (byte)uVar136 & (byte)uVar23;
      auVar74 = vmulss_avx512f(auVar74,ZEXT416(0x35000000));
      auVar83._8_4_ = 2;
      auVar83._0_8_ = 0x200000002;
      auVar83._12_4_ = 2;
      auVar83._16_4_ = 2;
      auVar83._20_4_ = 2;
      auVar83._24_4_ = 2;
      auVar83._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar83,ZEXT1632(auVar17));
      local_120 = vpermps_avx512vl(auVar83,ZEXT1632(auVar18));
      local_140 = vpermps_avx512vl(auVar83,ZEXT1632(auVar193));
      auVar83 = vpermps_avx2(auVar83,ZEXT1632(auVar19));
      uVar63 = *(uint *)(ray + k * 4 + 0x30);
      auVar73 = local_120._0_16_;
      local_2c0 = auVar74._0_4_;
      if (bVar66 == 0) {
        uVar60 = 0;
        auVar74 = vxorps_avx512vl(auVar73,auVar73);
        auVar194 = ZEXT1664(auVar74);
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar192 = ZEXT3264(auVar93);
        auVar190 = ZEXT3264(local_480);
        auVar195 = ZEXT3264(local_3e0);
        auVar196 = ZEXT3264(local_4a0);
        auVar197 = ZEXT3264(local_400);
        auVar198 = ZEXT3264(local_4c0);
        auVar200 = ZEXT3264(local_4e0);
        auVar191 = ZEXT3264(local_420);
        auVar199 = ZEXT3264(local_440);
      }
      else {
        local_520._0_16_ = ZEXT416(uVar63);
        auVar80 = vmulps_avx512vl(auVar83,auVar80);
        auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar80);
        auVar79 = vfmadd213ps_avx512vl(auVar79,local_120,auVar89);
        auVar88 = vfmadd213ps_avx512vl(auVar78,local_100,auVar79);
        auVar90 = vmulps_avx512vl(auVar83,auVar90);
        auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar90);
        auVar79 = vfmadd213ps_avx512vl(auVar95,local_120,auVar91);
        auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1210);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1694);
        auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1b18);
        auVar78 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1f9c);
        auVar92 = vfmadd213ps_avx512vl(auVar93,local_100,auVar79);
        auVar93 = vmulps_avx512vl(local_420,auVar78);
        auVar79 = vmulps_avx512vl(local_440,auVar78);
        auVar181._0_4_ = auVar83._0_4_ * auVar78._0_4_;
        auVar181._4_4_ = auVar83._4_4_ * auVar78._4_4_;
        auVar181._8_4_ = auVar83._8_4_ * auVar78._8_4_;
        auVar181._12_4_ = auVar83._12_4_ * auVar78._12_4_;
        auVar181._16_4_ = auVar83._16_4_ * auVar78._16_4_;
        auVar181._20_4_ = auVar83._20_4_ * auVar78._20_4_;
        auVar181._24_4_ = auVar83._24_4_ * auVar78._24_4_;
        auVar181._28_4_ = 0;
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,local_4c0);
        auVar78 = vfmadd231ps_avx512vl(auVar79,auVar90,local_4e0);
        auVar90 = vfmadd231ps_avx512vl(auVar181,local_140,auVar90);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,local_4a0);
        auVar78 = vfmadd231ps_avx512vl(auVar78,auVar91,local_400);
        auVar79 = vfmadd231ps_avx512vl(auVar90,local_120,auVar91);
        auVar190 = ZEXT3264(local_480);
        auVar89 = vfmadd231ps_avx512vl(auVar93,auVar95,local_480);
        auVar78 = vfmadd231ps_avx512vl(auVar78,auVar95,local_3e0);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1210);
        auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1b18);
        auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1f9c);
        auVar79 = vfmadd231ps_avx512vl(auVar79,local_100,auVar95);
        auVar80 = vmulps_avx512vl(local_420,auVar90);
        auVar94 = vmulps_avx512vl(local_440,auVar90);
        auVar95._4_4_ = auVar83._4_4_ * auVar90._4_4_;
        auVar95._0_4_ = auVar83._0_4_ * auVar90._0_4_;
        auVar95._8_4_ = auVar83._8_4_ * auVar90._8_4_;
        auVar95._12_4_ = auVar83._12_4_ * auVar90._12_4_;
        auVar95._16_4_ = auVar83._16_4_ * auVar90._16_4_;
        auVar95._20_4_ = auVar83._20_4_ * auVar90._20_4_;
        auVar95._24_4_ = auVar83._24_4_ * auVar90._24_4_;
        auVar95._28_4_ = auVar90._28_4_;
        auVar90 = vfmadd231ps_avx512vl(auVar80,auVar91,local_4c0);
        auVar80 = vfmadd231ps_avx512vl(auVar94,auVar91,local_4e0);
        auVar91 = vfmadd231ps_avx512vl(auVar95,local_140,auVar91);
        auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1694);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar95,local_4a0);
        auVar80 = vfmadd231ps_avx512vl(auVar80,auVar95,local_400);
        auVar95 = vfmadd231ps_avx512vl(auVar91,local_120,auVar95);
        auVar91 = vfmadd231ps_avx512vl(auVar90,auVar93,local_480);
        auVar90 = vfmadd231ps_avx512vl(auVar80,auVar93,local_3e0);
        auVar80 = vfmadd231ps_avx512vl(auVar95,local_100,auVar93);
        auVar186._8_4_ = 0x7fffffff;
        auVar186._0_8_ = 0x7fffffff7fffffff;
        auVar186._12_4_ = 0x7fffffff;
        auVar186._16_4_ = 0x7fffffff;
        auVar186._20_4_ = 0x7fffffff;
        auVar186._24_4_ = 0x7fffffff;
        auVar186._28_4_ = 0x7fffffff;
        auVar93 = vandps_avx(auVar89,auVar186);
        auVar95 = vandps_avx(auVar78,auVar186);
        auVar95 = vmaxps_avx(auVar93,auVar95);
        auVar93 = vandps_avx(auVar79,auVar186);
        auVar93 = vmaxps_avx(auVar95,auVar93);
        auVar79 = vbroadcastss_avx512vl(auVar74);
        uVar67 = vcmpps_avx512vl(auVar93,auVar79,1);
        bVar11 = (bool)((byte)uVar67 & 1);
        auVar94._0_4_ = (float)((uint)bVar11 * auVar84._0_4_ | (uint)!bVar11 * auVar89._0_4_);
        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar94._4_4_ = (float)((uint)bVar11 * auVar84._4_4_ | (uint)!bVar11 * auVar89._4_4_);
        bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar94._8_4_ = (float)((uint)bVar11 * auVar84._8_4_ | (uint)!bVar11 * auVar89._8_4_);
        bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar94._12_4_ = (float)((uint)bVar11 * auVar84._12_4_ | (uint)!bVar11 * auVar89._12_4_);
        bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar94._16_4_ = (float)((uint)bVar11 * auVar84._16_4_ | (uint)!bVar11 * auVar89._16_4_);
        bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar94._20_4_ = (float)((uint)bVar11 * auVar84._20_4_ | (uint)!bVar11 * auVar89._20_4_);
        bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar94._24_4_ = (float)((uint)bVar11 * auVar84._24_4_ | (uint)!bVar11 * auVar89._24_4_);
        bVar11 = SUB81(uVar67 >> 7,0);
        auVar94._28_4_ = (uint)bVar11 * auVar84._28_4_ | (uint)!bVar11 * auVar89._28_4_;
        bVar11 = (bool)((byte)uVar67 & 1);
        auVar96._0_4_ = (float)((uint)bVar11 * auVar85._0_4_ | (uint)!bVar11 * auVar78._0_4_);
        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar96._4_4_ = (float)((uint)bVar11 * auVar85._4_4_ | (uint)!bVar11 * auVar78._4_4_);
        bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar96._8_4_ = (float)((uint)bVar11 * auVar85._8_4_ | (uint)!bVar11 * auVar78._8_4_);
        bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar96._12_4_ = (float)((uint)bVar11 * auVar85._12_4_ | (uint)!bVar11 * auVar78._12_4_);
        bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar96._16_4_ = (float)((uint)bVar11 * auVar85._16_4_ | (uint)!bVar11 * auVar78._16_4_);
        bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar96._20_4_ = (float)((uint)bVar11 * auVar85._20_4_ | (uint)!bVar11 * auVar78._20_4_);
        bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar96._24_4_ = (float)((uint)bVar11 * auVar85._24_4_ | (uint)!bVar11 * auVar78._24_4_);
        bVar11 = SUB81(uVar67 >> 7,0);
        auVar96._28_4_ = (uint)bVar11 * auVar85._28_4_ | (uint)!bVar11 * auVar78._28_4_;
        auVar93 = vandps_avx(auVar186,auVar91);
        auVar95 = vandps_avx(auVar90,auVar186);
        auVar95 = vmaxps_avx(auVar93,auVar95);
        auVar93 = vandps_avx(auVar80,auVar186);
        auVar93 = vmaxps_avx(auVar95,auVar93);
        uVar67 = vcmpps_avx512vl(auVar93,auVar79,1);
        bVar11 = (bool)((byte)uVar67 & 1);
        auVar97._0_4_ = (float)((uint)bVar11 * auVar84._0_4_ | (uint)!bVar11 * auVar91._0_4_);
        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar97._4_4_ = (float)((uint)bVar11 * auVar84._4_4_ | (uint)!bVar11 * auVar91._4_4_);
        bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar97._8_4_ = (float)((uint)bVar11 * auVar84._8_4_ | (uint)!bVar11 * auVar91._8_4_);
        bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar97._12_4_ = (float)((uint)bVar11 * auVar84._12_4_ | (uint)!bVar11 * auVar91._12_4_);
        bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar97._16_4_ = (float)((uint)bVar11 * auVar84._16_4_ | (uint)!bVar11 * auVar91._16_4_);
        bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar97._20_4_ = (float)((uint)bVar11 * auVar84._20_4_ | (uint)!bVar11 * auVar91._20_4_);
        bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar97._24_4_ = (float)((uint)bVar11 * auVar84._24_4_ | (uint)!bVar11 * auVar91._24_4_);
        bVar11 = SUB81(uVar67 >> 7,0);
        auVar97._28_4_ = (uint)bVar11 * auVar84._28_4_ | (uint)!bVar11 * auVar91._28_4_;
        bVar11 = (bool)((byte)uVar67 & 1);
        auVar98._0_4_ = (float)((uint)bVar11 * auVar85._0_4_ | (uint)!bVar11 * auVar90._0_4_);
        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar11 * auVar85._4_4_ | (uint)!bVar11 * auVar90._4_4_);
        bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar11 * auVar85._8_4_ | (uint)!bVar11 * auVar90._8_4_);
        bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar11 * auVar85._12_4_ | (uint)!bVar11 * auVar90._12_4_);
        bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar98._16_4_ = (float)((uint)bVar11 * auVar85._16_4_ | (uint)!bVar11 * auVar90._16_4_);
        bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar98._20_4_ = (float)((uint)bVar11 * auVar85._20_4_ | (uint)!bVar11 * auVar90._20_4_);
        bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar98._24_4_ = (float)((uint)bVar11 * auVar85._24_4_ | (uint)!bVar11 * auVar90._24_4_);
        bVar11 = SUB81(uVar67 >> 7,0);
        auVar98._28_4_ = (uint)bVar11 * auVar85._28_4_ | (uint)!bVar11 * auVar90._28_4_;
        auVar77 = vxorps_avx512vl(auVar73,auVar73);
        auVar194 = ZEXT1664(auVar77);
        auVar93 = vfmadd213ps_avx512vl(auVar94,auVar94,ZEXT1632(auVar77));
        auVar73 = vfmadd231ps_fma(auVar93,auVar96,auVar96);
        auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar73));
        fVar148 = auVar95._0_4_;
        fVar133 = auVar95._4_4_;
        fVar134 = auVar95._8_4_;
        fVar135 = auVar95._12_4_;
        fVar166 = auVar95._16_4_;
        fVar169 = auVar95._20_4_;
        fVar68 = auVar95._24_4_;
        auVar93._4_4_ = fVar133 * fVar133 * fVar133 * auVar73._4_4_ * -0.5;
        auVar93._0_4_ = fVar148 * fVar148 * fVar148 * auVar73._0_4_ * -0.5;
        auVar93._8_4_ = fVar134 * fVar134 * fVar134 * auVar73._8_4_ * -0.5;
        auVar93._12_4_ = fVar135 * fVar135 * fVar135 * auVar73._12_4_ * -0.5;
        auVar93._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar93._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar93._24_4_ = fVar68 * fVar68 * fVar68 * -0.0;
        auVar93._28_4_ = auVar80._28_4_;
        auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar78,auVar95);
        auVar91._4_4_ = auVar96._4_4_ * auVar93._4_4_;
        auVar91._0_4_ = auVar96._0_4_ * auVar93._0_4_;
        auVar91._8_4_ = auVar96._8_4_ * auVar93._8_4_;
        auVar91._12_4_ = auVar96._12_4_ * auVar93._12_4_;
        auVar91._16_4_ = auVar96._16_4_ * auVar93._16_4_;
        auVar91._20_4_ = auVar96._20_4_ * auVar93._20_4_;
        auVar91._24_4_ = auVar96._24_4_ * auVar93._24_4_;
        auVar91._28_4_ = 0;
        auVar90._4_4_ = auVar93._4_4_ * -auVar94._4_4_;
        auVar90._0_4_ = auVar93._0_4_ * -auVar94._0_4_;
        auVar90._8_4_ = auVar93._8_4_ * -auVar94._8_4_;
        auVar90._12_4_ = auVar93._12_4_ * -auVar94._12_4_;
        auVar90._16_4_ = auVar93._16_4_ * -auVar94._16_4_;
        auVar90._20_4_ = auVar93._20_4_ * -auVar94._20_4_;
        auVar90._24_4_ = auVar93._24_4_ * -auVar94._24_4_;
        auVar90._28_4_ = auVar96._28_4_;
        auVar93 = vmulps_avx512vl(auVar93,ZEXT1632(auVar77));
        auVar84 = ZEXT1632(auVar77);
        auVar95 = vfmadd213ps_avx512vl(auVar97,auVar97,auVar84);
        auVar73 = vfmadd231ps_fma(auVar95,auVar98,auVar98);
        auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar73));
        fVar148 = auVar95._0_4_;
        fVar133 = auVar95._4_4_;
        fVar134 = auVar95._8_4_;
        fVar135 = auVar95._12_4_;
        fVar166 = auVar95._16_4_;
        fVar169 = auVar95._20_4_;
        fVar68 = auVar95._24_4_;
        auVar79._4_4_ = fVar133 * fVar133 * fVar133 * auVar73._4_4_ * -0.5;
        auVar79._0_4_ = fVar148 * fVar148 * fVar148 * auVar73._0_4_ * -0.5;
        auVar79._8_4_ = fVar134 * fVar134 * fVar134 * auVar73._8_4_ * -0.5;
        auVar79._12_4_ = fVar135 * fVar135 * fVar135 * auVar73._12_4_ * -0.5;
        auVar79._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar79._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar79._24_4_ = fVar68 * fVar68 * fVar68 * -0.0;
        auVar79._28_4_ = 0;
        auVar78 = vfmadd231ps_avx512vl(auVar79,auVar78,auVar95);
        auVar89._4_4_ = auVar98._4_4_ * auVar78._4_4_;
        auVar89._0_4_ = auVar98._0_4_ * auVar78._0_4_;
        auVar89._8_4_ = auVar98._8_4_ * auVar78._8_4_;
        auVar89._12_4_ = auVar98._12_4_ * auVar78._12_4_;
        auVar89._16_4_ = auVar98._16_4_ * auVar78._16_4_;
        auVar89._20_4_ = auVar98._20_4_ * auVar78._20_4_;
        auVar89._24_4_ = auVar98._24_4_ * auVar78._24_4_;
        auVar89._28_4_ = auVar95._28_4_;
        auVar80._4_4_ = -auVar97._4_4_ * auVar78._4_4_;
        auVar80._0_4_ = -auVar97._0_4_ * auVar78._0_4_;
        auVar80._8_4_ = -auVar97._8_4_ * auVar78._8_4_;
        auVar80._12_4_ = -auVar97._12_4_ * auVar78._12_4_;
        auVar80._16_4_ = -auVar97._16_4_ * auVar78._16_4_;
        auVar80._20_4_ = -auVar97._20_4_ * auVar78._20_4_;
        auVar80._24_4_ = -auVar97._24_4_ * auVar78._24_4_;
        auVar80._28_4_ = auVar97._28_4_ ^ 0x80000000;
        auVar95 = vmulps_avx512vl(auVar78,auVar84);
        auVar73 = vfmadd213ps_fma(auVar91,auVar86,auVar81);
        auVar193 = vfmadd213ps_fma(auVar90,auVar86,auVar82);
        auVar78 = vfmadd213ps_avx512vl(auVar93,auVar86,auVar92);
        auVar79 = vfmadd213ps_avx512vl(auVar89,ZEXT1632(auVar22),ZEXT1632(auVar20));
        auVar75 = vfnmadd213ps_fma(auVar91,auVar86,auVar81);
        auVar81 = ZEXT1632(auVar22);
        auVar17 = vfmadd213ps_fma(auVar80,auVar81,ZEXT1632(auVar21));
        auVar76 = vfnmadd213ps_fma(auVar90,auVar86,auVar82);
        auVar18 = vfmadd213ps_fma(auVar95,auVar81,auVar88);
        auVar91 = vfnmadd231ps_avx512vl(auVar92,auVar86,auVar93);
        auVar26 = vfnmadd213ps_fma(auVar89,auVar81,ZEXT1632(auVar20));
        auVar21 = vfnmadd213ps_fma(auVar80,auVar81,ZEXT1632(auVar21));
        auVar27 = vfnmadd231ps_fma(auVar88,ZEXT1632(auVar22),auVar95);
        auVar95 = vsubps_avx512vl(auVar79,ZEXT1632(auVar75));
        auVar93 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar76));
        auVar90 = vsubps_avx512vl(ZEXT1632(auVar18),auVar91);
        auVar89 = vmulps_avx512vl(auVar93,auVar91);
        auVar19 = vfmsub231ps_fma(auVar89,ZEXT1632(auVar76),auVar90);
        auVar81._4_4_ = auVar75._4_4_ * auVar90._4_4_;
        auVar81._0_4_ = auVar75._0_4_ * auVar90._0_4_;
        auVar81._8_4_ = auVar75._8_4_ * auVar90._8_4_;
        auVar81._12_4_ = auVar75._12_4_ * auVar90._12_4_;
        auVar81._16_4_ = auVar90._16_4_ * 0.0;
        auVar81._20_4_ = auVar90._20_4_ * 0.0;
        auVar81._24_4_ = auVar90._24_4_ * 0.0;
        auVar81._28_4_ = auVar90._28_4_;
        auVar90 = vfmsub231ps_avx512vl(auVar81,auVar91,auVar95);
        auVar82._4_4_ = auVar76._4_4_ * auVar95._4_4_;
        auVar82._0_4_ = auVar76._0_4_ * auVar95._0_4_;
        auVar82._8_4_ = auVar76._8_4_ * auVar95._8_4_;
        auVar82._12_4_ = auVar76._12_4_ * auVar95._12_4_;
        auVar82._16_4_ = auVar95._16_4_ * 0.0;
        auVar82._20_4_ = auVar95._20_4_ * 0.0;
        auVar82._24_4_ = auVar95._24_4_ * 0.0;
        auVar82._28_4_ = auVar95._28_4_;
        auVar20 = vfmsub231ps_fma(auVar82,ZEXT1632(auVar75),auVar93);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar84,auVar90);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar84,ZEXT1632(auVar19));
        auVar94 = ZEXT1632(auVar77);
        uVar67 = vcmpps_avx512vl(auVar93,auVar94,2);
        bVar58 = (byte)uVar67;
        fVar68 = (float)((uint)(bVar58 & 1) * auVar73._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar26._0_4_);
        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
        fVar115 = (float)((uint)bVar11 * auVar73._4_4_ | (uint)!bVar11 * auVar26._4_4_);
        bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
        fVar117 = (float)((uint)bVar11 * auVar73._8_4_ | (uint)!bVar11 * auVar26._8_4_);
        bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
        fVar120 = (float)((uint)bVar11 * auVar73._12_4_ | (uint)!bVar11 * auVar26._12_4_);
        auVar89 = ZEXT1632(CONCAT412(fVar120,CONCAT48(fVar117,CONCAT44(fVar115,fVar68))));
        fVar69 = (float)((uint)(bVar58 & 1) * auVar193._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar21._0_4_);
        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
        fVar116 = (float)((uint)bVar11 * auVar193._4_4_ | (uint)!bVar11 * auVar21._4_4_);
        bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
        fVar118 = (float)((uint)bVar11 * auVar193._8_4_ | (uint)!bVar11 * auVar21._8_4_);
        bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
        fVar121 = (float)((uint)bVar11 * auVar193._12_4_ | (uint)!bVar11 * auVar21._12_4_);
        auVar80 = ZEXT1632(CONCAT412(fVar121,CONCAT48(fVar118,CONCAT44(fVar116,fVar69))));
        auVar92._0_4_ =
             (float)((uint)(bVar58 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar27._0_4_)
        ;
        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar92._4_4_ = (float)((uint)bVar11 * auVar78._4_4_ | (uint)!bVar11 * auVar27._4_4_);
        bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar92._8_4_ = (float)((uint)bVar11 * auVar78._8_4_ | (uint)!bVar11 * auVar27._8_4_);
        bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar92._12_4_ = (float)((uint)bVar11 * auVar78._12_4_ | (uint)!bVar11 * auVar27._12_4_);
        fVar148 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar78._16_4_);
        auVar92._16_4_ = fVar148;
        fVar133 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar78._20_4_);
        auVar92._20_4_ = fVar133;
        fVar134 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar78._24_4_);
        auVar92._24_4_ = fVar134;
        iVar1 = (uint)(byte)(uVar67 >> 7) * auVar78._28_4_;
        auVar92._28_4_ = iVar1;
        auVar95 = vblendmps_avx512vl(ZEXT1632(auVar75),auVar79);
        auVar99._0_4_ =
             (uint)(bVar58 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar19._0_4_;
        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar99._4_4_ = (uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * auVar19._4_4_;
        bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar99._8_4_ = (uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * auVar19._8_4_;
        bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar99._12_4_ = (uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * auVar19._12_4_;
        auVar99._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar95._16_4_;
        auVar99._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar95._20_4_;
        auVar99._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar95._24_4_;
        auVar99._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar95._28_4_;
        auVar95 = vblendmps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar17));
        auVar100._0_4_ =
             (float)((uint)(bVar58 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar193._0_4_
                    );
        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * auVar193._4_4_);
        bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * auVar193._8_4_);
        bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * auVar193._12_4_);
        fVar135 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar95._16_4_);
        auVar100._16_4_ = fVar135;
        fVar166 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar95._20_4_);
        auVar100._20_4_ = fVar166;
        fVar169 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar95._24_4_);
        auVar100._24_4_ = fVar169;
        auVar100._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar95._28_4_;
        auVar95 = vblendmps_avx512vl(auVar91,ZEXT1632(auVar18));
        auVar101._0_4_ =
             (float)((uint)(bVar58 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar78._0_4_)
        ;
        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar11 * auVar95._4_4_ | (uint)!bVar11 * auVar78._4_4_);
        bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar11 * auVar95._8_4_ | (uint)!bVar11 * auVar78._8_4_);
        bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar11 * auVar95._12_4_ | (uint)!bVar11 * auVar78._12_4_);
        bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar11 * auVar95._16_4_ | (uint)!bVar11 * auVar78._16_4_);
        bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar11 * auVar95._20_4_ | (uint)!bVar11 * auVar78._20_4_);
        bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar11 * auVar95._24_4_ | (uint)!bVar11 * auVar78._24_4_);
        bVar11 = SUB81(uVar67 >> 7,0);
        auVar101._28_4_ = (uint)bVar11 * auVar95._28_4_ | (uint)!bVar11 * auVar78._28_4_;
        auVar102._0_4_ =
             (uint)(bVar58 & 1) * (int)auVar75._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar79._0_4_;
        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar102._4_4_ = (uint)bVar11 * (int)auVar75._4_4_ | (uint)!bVar11 * auVar79._4_4_;
        bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar102._8_4_ = (uint)bVar11 * (int)auVar75._8_4_ | (uint)!bVar11 * auVar79._8_4_;
        bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar102._12_4_ = (uint)bVar11 * (int)auVar75._12_4_ | (uint)!bVar11 * auVar79._12_4_;
        auVar102._16_4_ = (uint)!(bool)((byte)(uVar67 >> 4) & 1) * auVar79._16_4_;
        auVar102._20_4_ = (uint)!(bool)((byte)(uVar67 >> 5) & 1) * auVar79._20_4_;
        auVar102._24_4_ = (uint)!(bool)((byte)(uVar67 >> 6) & 1) * auVar79._24_4_;
        auVar102._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar79._28_4_;
        bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar103._0_4_ =
             (uint)(bVar58 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar18._0_4_;
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar103._4_4_ = (uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar18._4_4_;
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar103._8_4_ = (uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar18._8_4_;
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar103._12_4_ = (uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar18._12_4_;
        auVar103._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar91._16_4_;
        auVar103._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar91._20_4_;
        auVar103._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar91._24_4_;
        iVar2 = (uint)(byte)(uVar67 >> 7) * auVar91._28_4_;
        auVar103._28_4_ = iVar2;
        auVar81 = vsubps_avx512vl(auVar102,auVar89);
        auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar76._12_4_ |
                                                (uint)!bVar14 * auVar17._12_4_,
                                                CONCAT48((uint)bVar13 * (int)auVar76._8_4_ |
                                                         (uint)!bVar13 * auVar17._8_4_,
                                                         CONCAT44((uint)bVar11 * (int)auVar76._4_4_
                                                                  | (uint)!bVar11 * auVar17._4_4_,
                                                                  (uint)(bVar58 & 1) *
                                                                  (int)auVar76._0_4_ |
                                                                  (uint)!(bool)(bVar58 & 1) *
                                                                  auVar17._0_4_)))),auVar80);
        auVar91 = vsubps_avx(auVar103,auVar92);
        auVar90 = vsubps_avx(auVar89,auVar99);
        auVar78 = vsubps_avx(auVar80,auVar100);
        auVar79 = vsubps_avx(auVar92,auVar101);
        auVar84._4_4_ = auVar91._4_4_ * fVar115;
        auVar84._0_4_ = auVar91._0_4_ * fVar68;
        auVar84._8_4_ = auVar91._8_4_ * fVar117;
        auVar84._12_4_ = auVar91._12_4_ * fVar120;
        auVar84._16_4_ = auVar91._16_4_ * 0.0;
        auVar84._20_4_ = auVar91._20_4_ * 0.0;
        auVar84._24_4_ = auVar91._24_4_ * 0.0;
        auVar84._28_4_ = iVar2;
        auVar73 = vfmsub231ps_fma(auVar84,auVar92,auVar81);
        auVar85._4_4_ = fVar116 * auVar81._4_4_;
        auVar85._0_4_ = fVar69 * auVar81._0_4_;
        auVar85._8_4_ = fVar118 * auVar81._8_4_;
        auVar85._12_4_ = fVar121 * auVar81._12_4_;
        auVar85._16_4_ = auVar81._16_4_ * 0.0;
        auVar85._20_4_ = auVar81._20_4_ * 0.0;
        auVar85._24_4_ = auVar81._24_4_ * 0.0;
        auVar85._28_4_ = auVar93._28_4_;
        auVar193 = vfmsub231ps_fma(auVar85,auVar89,auVar95);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar193),auVar94,ZEXT1632(auVar73));
        auVar157._0_4_ = auVar95._0_4_ * auVar92._0_4_;
        auVar157._4_4_ = auVar95._4_4_ * auVar92._4_4_;
        auVar157._8_4_ = auVar95._8_4_ * auVar92._8_4_;
        auVar157._12_4_ = auVar95._12_4_ * auVar92._12_4_;
        auVar157._16_4_ = auVar95._16_4_ * fVar148;
        auVar157._20_4_ = auVar95._20_4_ * fVar133;
        auVar157._24_4_ = auVar95._24_4_ * fVar134;
        auVar157._28_4_ = 0;
        auVar73 = vfmsub231ps_fma(auVar157,auVar80,auVar91);
        auVar82 = vfmadd231ps_avx512vl(auVar93,auVar94,ZEXT1632(auVar73));
        auVar93 = vmulps_avx512vl(auVar79,auVar99);
        auVar93 = vfmsub231ps_avx512vl(auVar93,auVar90,auVar101);
        auVar88._4_4_ = auVar78._4_4_ * auVar101._4_4_;
        auVar88._0_4_ = auVar78._0_4_ * auVar101._0_4_;
        auVar88._8_4_ = auVar78._8_4_ * auVar101._8_4_;
        auVar88._12_4_ = auVar78._12_4_ * auVar101._12_4_;
        auVar88._16_4_ = auVar78._16_4_ * auVar101._16_4_;
        auVar88._20_4_ = auVar78._20_4_ * auVar101._20_4_;
        auVar88._24_4_ = auVar78._24_4_ * auVar101._24_4_;
        auVar88._28_4_ = auVar101._28_4_;
        auVar73 = vfmsub231ps_fma(auVar88,auVar100,auVar79);
        auVar158._0_4_ = auVar100._0_4_ * auVar90._0_4_;
        auVar158._4_4_ = auVar100._4_4_ * auVar90._4_4_;
        auVar158._8_4_ = auVar100._8_4_ * auVar90._8_4_;
        auVar158._12_4_ = auVar100._12_4_ * auVar90._12_4_;
        auVar158._16_4_ = fVar135 * auVar90._16_4_;
        auVar158._20_4_ = fVar166 * auVar90._20_4_;
        auVar158._24_4_ = fVar169 * auVar90._24_4_;
        auVar158._28_4_ = 0;
        auVar193 = vfmsub231ps_fma(auVar158,auVar78,auVar99);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar193),auVar94,auVar93);
        auVar84 = vfmadd231ps_avx512vl(auVar93,auVar94,ZEXT1632(auVar73));
        auVar93 = vmaxps_avx(auVar82,auVar84);
        uVar136 = vcmpps_avx512vl(auVar93,auVar94,2);
        bVar66 = bVar66 & (byte)uVar136;
        auVar195 = ZEXT3264(local_3e0);
        auVar196 = ZEXT3264(local_4a0);
        auVar197 = ZEXT3264(local_400);
        auVar198 = ZEXT3264(local_4c0);
        auVar200 = ZEXT3264(local_4e0);
        auVar191 = ZEXT3264(local_420);
        auVar199 = ZEXT3264(local_440);
        auVar184 = ZEXT1664(auVar74);
        if (bVar66 == 0) {
          uVar60 = 0;
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar192 = ZEXT3264(auVar93);
        }
        else {
          auVar85 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
          auVar189 = ZEXT3264(auVar85);
          auVar33._4_4_ = auVar79._4_4_ * auVar95._4_4_;
          auVar33._0_4_ = auVar79._0_4_ * auVar95._0_4_;
          auVar33._8_4_ = auVar79._8_4_ * auVar95._8_4_;
          auVar33._12_4_ = auVar79._12_4_ * auVar95._12_4_;
          auVar33._16_4_ = auVar79._16_4_ * auVar95._16_4_;
          auVar33._20_4_ = auVar79._20_4_ * auVar95._20_4_;
          auVar33._24_4_ = auVar79._24_4_ * auVar95._24_4_;
          auVar33._28_4_ = auVar93._28_4_;
          auVar17 = vfmsub231ps_fma(auVar33,auVar78,auVar91);
          auVar34._4_4_ = auVar91._4_4_ * auVar90._4_4_;
          auVar34._0_4_ = auVar91._0_4_ * auVar90._0_4_;
          auVar34._8_4_ = auVar91._8_4_ * auVar90._8_4_;
          auVar34._12_4_ = auVar91._12_4_ * auVar90._12_4_;
          auVar34._16_4_ = auVar91._16_4_ * auVar90._16_4_;
          auVar34._20_4_ = auVar91._20_4_ * auVar90._20_4_;
          auVar34._24_4_ = auVar91._24_4_ * auVar90._24_4_;
          auVar34._28_4_ = auVar91._28_4_;
          auVar193 = vfmsub231ps_fma(auVar34,auVar81,auVar79);
          auVar35._4_4_ = auVar78._4_4_ * auVar81._4_4_;
          auVar35._0_4_ = auVar78._0_4_ * auVar81._0_4_;
          auVar35._8_4_ = auVar78._8_4_ * auVar81._8_4_;
          auVar35._12_4_ = auVar78._12_4_ * auVar81._12_4_;
          auVar35._16_4_ = auVar78._16_4_ * auVar81._16_4_;
          auVar35._20_4_ = auVar78._20_4_ * auVar81._20_4_;
          auVar35._24_4_ = auVar78._24_4_ * auVar81._24_4_;
          auVar35._28_4_ = auVar78._28_4_;
          auVar18 = vfmsub231ps_fma(auVar35,auVar90,auVar95);
          auVar73 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar193),ZEXT1632(auVar18));
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar17),auVar94);
          auVar95 = vrcp14ps_avx512vl(auVar93);
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar192 = ZEXT3264(auVar91);
          auVar90 = vfnmadd213ps_avx512vl(auVar95,auVar93,auVar91);
          auVar73 = vfmadd132ps_fma(auVar90,auVar95,auVar95);
          auVar36._4_4_ = auVar18._4_4_ * auVar92._4_4_;
          auVar36._0_4_ = auVar18._0_4_ * auVar92._0_4_;
          auVar36._8_4_ = auVar18._8_4_ * auVar92._8_4_;
          auVar36._12_4_ = auVar18._12_4_ * auVar92._12_4_;
          auVar36._16_4_ = fVar148 * 0.0;
          auVar36._20_4_ = fVar133 * 0.0;
          auVar36._24_4_ = fVar134 * 0.0;
          auVar36._28_4_ = iVar1;
          auVar193 = vfmadd231ps_fma(auVar36,auVar80,ZEXT1632(auVar193));
          auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar89,ZEXT1632(auVar17));
          fVar148 = auVar73._0_4_;
          fVar133 = auVar73._4_4_;
          fVar134 = auVar73._8_4_;
          fVar135 = auVar73._12_4_;
          local_240 = ZEXT1632(CONCAT412(auVar193._12_4_ * fVar135,
                                         CONCAT48(auVar193._8_4_ * fVar134,
                                                  CONCAT44(auVar193._4_4_ * fVar133,
                                                           auVar193._0_4_ * fVar148))));
          auVar172._4_4_ = uVar63;
          auVar172._0_4_ = uVar63;
          auVar172._8_4_ = uVar63;
          auVar172._12_4_ = uVar63;
          auVar172._16_4_ = uVar63;
          auVar172._20_4_ = uVar63;
          auVar172._24_4_ = uVar63;
          auVar172._28_4_ = uVar63;
          uVar136 = vcmpps_avx512vl(local_240,auVar85,2);
          uVar23 = vcmpps_avx512vl(auVar172,local_240,2);
          bVar66 = (byte)uVar136 & (byte)uVar23 & bVar66;
          auVar188 = ZEXT3264(auVar83);
          if (bVar66 != 0) {
            uVar136 = vcmpps_avx512vl(auVar93,auVar94,4);
            bVar66 = bVar66 & (byte)uVar136;
            if (bVar66 != 0) {
              fVar166 = auVar82._0_4_ * fVar148;
              fVar169 = auVar82._4_4_ * fVar133;
              auVar37._4_4_ = fVar169;
              auVar37._0_4_ = fVar166;
              fVar68 = auVar82._8_4_ * fVar134;
              auVar37._8_4_ = fVar68;
              fVar69 = auVar82._12_4_ * fVar135;
              auVar37._12_4_ = fVar69;
              fVar115 = auVar82._16_4_ * 0.0;
              auVar37._16_4_ = fVar115;
              fVar116 = auVar82._20_4_ * 0.0;
              auVar37._20_4_ = fVar116;
              fVar117 = auVar82._24_4_ * 0.0;
              auVar37._24_4_ = fVar117;
              auVar37._28_4_ = auVar93._28_4_;
              auVar95 = vsubps_avx512vl(auVar91,auVar37);
              local_280._0_4_ =
                   (float)((uint)(bVar58 & 1) * (int)fVar166 |
                          (uint)!(bool)(bVar58 & 1) * auVar95._0_4_);
              bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
              local_280._4_4_ = (float)((uint)bVar11 * (int)fVar169 | (uint)!bVar11 * auVar95._4_4_)
              ;
              bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
              local_280._8_4_ = (float)((uint)bVar11 * (int)fVar68 | (uint)!bVar11 * auVar95._8_4_);
              bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
              local_280._12_4_ =
                   (float)((uint)bVar11 * (int)fVar69 | (uint)!bVar11 * auVar95._12_4_);
              bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
              local_280._16_4_ =
                   (float)((uint)bVar11 * (int)fVar115 | (uint)!bVar11 * auVar95._16_4_);
              bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
              local_280._20_4_ =
                   (float)((uint)bVar11 * (int)fVar116 | (uint)!bVar11 * auVar95._20_4_);
              bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
              local_280._24_4_ =
                   (float)((uint)bVar11 * (int)fVar117 | (uint)!bVar11 * auVar95._24_4_);
              bVar11 = SUB81(uVar67 >> 7,0);
              local_280._28_4_ =
                   (float)((uint)bVar11 * auVar93._28_4_ | (uint)!bVar11 * auVar95._28_4_);
              auVar93 = vsubps_avx(ZEXT1632(auVar22),auVar86);
              auVar73 = vfmadd213ps_fma(auVar93,local_280,auVar86);
              uVar124 = *(undefined4 *)((long)local_5b8->ray_space + k * 4 + -0x10);
              auVar86._4_4_ = uVar124;
              auVar86._0_4_ = uVar124;
              auVar86._8_4_ = uVar124;
              auVar86._12_4_ = uVar124;
              auVar86._16_4_ = uVar124;
              auVar86._20_4_ = uVar124;
              auVar86._24_4_ = uVar124;
              auVar86._28_4_ = uVar124;
              auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar73._12_4_ + auVar73._12_4_,
                                                           CONCAT48(auVar73._8_4_ + auVar73._8_4_,
                                                                    CONCAT44(auVar73._4_4_ +
                                                                             auVar73._4_4_,
                                                                             auVar73._0_4_ +
                                                                             auVar73._0_4_)))),
                                        auVar86);
              uVar136 = vcmpps_avx512vl(local_240,auVar93,6);
              if (((byte)uVar136 & bVar66) != 0) {
                auVar153._0_4_ = auVar84._0_4_ * fVar148;
                auVar153._4_4_ = auVar84._4_4_ * fVar133;
                auVar153._8_4_ = auVar84._8_4_ * fVar134;
                auVar153._12_4_ = auVar84._12_4_ * fVar135;
                auVar153._16_4_ = auVar84._16_4_ * 0.0;
                auVar153._20_4_ = auVar84._20_4_ * 0.0;
                auVar153._24_4_ = auVar84._24_4_ * 0.0;
                auVar153._28_4_ = 0;
                auVar93 = vsubps_avx512vl(auVar91,auVar153);
                auVar104._0_4_ =
                     (uint)(bVar58 & 1) * (int)auVar153._0_4_ |
                     (uint)!(bool)(bVar58 & 1) * auVar93._0_4_;
                bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
                auVar104._4_4_ = (uint)bVar11 * (int)auVar153._4_4_ | (uint)!bVar11 * auVar93._4_4_;
                bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
                auVar104._8_4_ = (uint)bVar11 * (int)auVar153._8_4_ | (uint)!bVar11 * auVar93._8_4_;
                bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
                auVar104._12_4_ =
                     (uint)bVar11 * (int)auVar153._12_4_ | (uint)!bVar11 * auVar93._12_4_;
                bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
                auVar104._16_4_ =
                     (uint)bVar11 * (int)auVar153._16_4_ | (uint)!bVar11 * auVar93._16_4_;
                bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
                auVar104._20_4_ =
                     (uint)bVar11 * (int)auVar153._20_4_ | (uint)!bVar11 * auVar93._20_4_;
                bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
                auVar104._24_4_ =
                     (uint)bVar11 * (int)auVar153._24_4_ | (uint)!bVar11 * auVar93._24_4_;
                auVar104._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar93._28_4_;
                auVar30._8_4_ = 0x40000000;
                auVar30._0_8_ = 0x4000000040000000;
                auVar30._12_4_ = 0x40000000;
                auVar30._16_4_ = 0x40000000;
                auVar30._20_4_ = 0x40000000;
                auVar30._24_4_ = 0x40000000;
                auVar30._28_4_ = 0x40000000;
                local_260 = vfmsub132ps_avx512vl(auVar104,auVar91,auVar30);
                local_220 = 0;
                local_210 = local_540._0_8_;
                uStack_208 = local_540._8_8_;
                local_200 = local_550._0_8_;
                uStack_1f8 = local_550._8_8_;
                local_1f0 = local_560._0_8_;
                uStack_1e8 = local_560._8_8_;
                if ((pGVar62->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar60 = CONCAT71((int7)(uVar60 >> 8),1),
                     pGVar62->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar148 = 1.0 / auVar87._0_4_;
                    local_1c0[0] = fVar148 * (local_280._0_4_ + 0.0);
                    local_1c0[1] = fVar148 * (local_280._4_4_ + 1.0);
                    local_1c0[2] = fVar148 * (local_280._8_4_ + 2.0);
                    local_1c0[3] = fVar148 * (local_280._12_4_ + 3.0);
                    fStack_1b0 = fVar148 * (local_280._16_4_ + 4.0);
                    fStack_1ac = fVar148 * (local_280._20_4_ + 5.0);
                    fStack_1a8 = fVar148 * (local_280._24_4_ + 6.0);
                    fStack_1a4 = local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    lVar64 = 0;
                    uVar61 = (ulong)((byte)uVar136 & bVar66);
                    for (uVar67 = uVar61; (uVar67 & 1) == 0;
                        uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                      lVar64 = lVar64 + 1;
                    }
                    _local_2e0 = vpbroadcastd_avx512vl();
                    local_5d0 = vpbroadcastd_avx512vl();
                    local_5e0 = auVar74;
                    local_500 = auVar83;
                    local_460 = auVar85;
                    local_21c = iVar7;
                    do {
                      auVar193 = auVar194._0_16_;
                      local_340 = local_1c0[lVar64];
                      local_2c0 = (uint)lVar64;
                      uStack_2bc = (undefined4)((ulong)lVar64 >> 0x20);
                      local_330 = *(undefined4 *)(local_1a0 + lVar64 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + lVar64 * 4);
                      local_5b0.context = context->user;
                      fVar133 = 1.0 - local_340;
                      fVar148 = fVar133 * fVar133 * -3.0;
                      auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133)),
                                                ZEXT416((uint)(local_340 * fVar133)),
                                                ZEXT416(0xc0000000));
                      auVar73 = vfmsub132ss_fma(ZEXT416((uint)(local_340 * fVar133)),
                                                ZEXT416((uint)(local_340 * local_340)),
                                                ZEXT416(0x40000000));
                      fVar133 = auVar74._0_4_ * 3.0;
                      fVar134 = auVar73._0_4_ * 3.0;
                      fVar135 = local_340 * local_340 * 3.0;
                      auVar164._0_4_ = fVar135 * (float)local_3b0._0_4_;
                      auVar164._4_4_ = fVar135 * (float)local_3b0._4_4_;
                      auVar164._8_4_ = fVar135 * fStack_3a8;
                      auVar164._12_4_ = fVar135 * fStack_3a4;
                      auVar129._4_4_ = fVar134;
                      auVar129._0_4_ = fVar134;
                      auVar129._8_4_ = fVar134;
                      auVar129._12_4_ = fVar134;
                      auVar74 = vfmadd132ps_fma(auVar129,auVar164,local_560);
                      auVar151._4_4_ = fVar133;
                      auVar151._0_4_ = fVar133;
                      auVar151._8_4_ = fVar133;
                      auVar151._12_4_ = fVar133;
                      auVar74 = vfmadd132ps_fma(auVar151,auVar74,local_550);
                      auVar130._4_4_ = fVar148;
                      auVar130._0_4_ = fVar148;
                      auVar130._8_4_ = fVar148;
                      auVar130._12_4_ = fVar148;
                      auVar74 = vfmadd132ps_fma(auVar130,auVar74,local_540);
                      local_370 = auVar74._0_4_;
                      local_360 = vshufps_avx(auVar74,auVar74,0x55);
                      local_350 = vshufps_avx(auVar74,auVar74,0xaa);
                      local_320 = local_5d0._0_8_;
                      uStack_318 = local_5d0._8_8_;
                      local_310 = _local_2e0;
                      vpcmpeqd_avx2(ZEXT1632(_local_2e0),ZEXT1632(_local_2e0));
                      uStack_2fc = (local_5b0.context)->instID[0];
                      local_300 = uStack_2fc;
                      uStack_2f8 = uStack_2fc;
                      uStack_2f4 = uStack_2fc;
                      uStack_2f0 = (local_5b0.context)->instPrimID[0];
                      uStack_2ec = uStack_2f0;
                      uStack_2e8 = uStack_2f0;
                      uStack_2e4 = uStack_2f0;
                      local_600 = local_3c0;
                      local_5b0.valid = (int *)local_600;
                      local_5b0.geometryUserPtr = pGVar62->userPtr;
                      local_5b0.hit = (RTCHitN *)&local_370;
                      local_5b0.N = 4;
                      local_3a0 = (uint)uVar61;
                      uStack_39c = (uint)(uVar61 >> 0x20);
                      local_5b0.ray = (RTCRayN *)ray;
                      uStack_36c = local_370;
                      uStack_368 = local_370;
                      uStack_364 = local_370;
                      fStack_33c = local_340;
                      fStack_338 = local_340;
                      fStack_334 = local_340;
                      uStack_32c = local_330;
                      uStack_328 = local_330;
                      uStack_324 = local_330;
                      if (pGVar62->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar62->occlusionFilterN)(&local_5b0);
                        uVar61 = CONCAT44(uStack_39c,local_3a0);
                        auVar189 = ZEXT3264(local_460);
                        auVar184 = ZEXT1664(local_5e0);
                        auVar188 = ZEXT3264(local_500);
                        auVar199 = ZEXT3264(local_440);
                        auVar191 = ZEXT3264(local_420);
                        auVar200 = ZEXT3264(local_4e0);
                        auVar198 = ZEXT3264(local_4c0);
                        auVar197 = ZEXT3264(local_400);
                        auVar196 = ZEXT3264(local_4a0);
                        auVar195 = ZEXT3264(local_3e0);
                        auVar190 = ZEXT3264(local_480);
                        auVar74 = vxorps_avx512vl(auVar193,auVar193);
                        auVar194 = ZEXT1664(auVar74);
                        uVar63 = local_520._0_4_;
                      }
                      auVar74 = auVar194._0_16_;
                      uVar67 = vptestmd_avx512vl(local_600,local_600);
                      if ((uVar67 & 0xf) == 0) {
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar192 = ZEXT3264(auVar93);
                      }
                      else {
                        p_Var10 = context->args->filter;
                        if (p_Var10 == (RTCFilterFunctionN)0x0) {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar192 = ZEXT3264(auVar93);
                        }
                        else {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar192 = ZEXT3264(auVar93);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar62->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var10)(&local_5b0);
                            uVar61 = CONCAT44(uStack_39c,local_3a0);
                            auVar189 = ZEXT3264(local_460);
                            auVar184 = ZEXT1664(local_5e0);
                            auVar188 = ZEXT3264(local_500);
                            auVar199 = ZEXT3264(local_440);
                            auVar191 = ZEXT3264(local_420);
                            auVar200 = ZEXT3264(local_4e0);
                            auVar198 = ZEXT3264(local_4c0);
                            auVar197 = ZEXT3264(local_400);
                            auVar196 = ZEXT3264(local_4a0);
                            auVar195 = ZEXT3264(local_3e0);
                            auVar190 = ZEXT3264(local_480);
                            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar192 = ZEXT3264(auVar93);
                            auVar74 = vxorps_avx512vl(auVar74,auVar74);
                            auVar194 = ZEXT1664(auVar74);
                            uVar63 = local_520._0_4_;
                          }
                        }
                        auVar83 = auVar188._0_32_;
                        uVar67 = vptestmd_avx512vl(local_600,local_600);
                        uVar67 = uVar67 & 0xf;
                        auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar11 = (bool)((byte)uVar67 & 1);
                        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar14 = SUB81(uVar67 >> 3,0);
                        *(uint *)(local_5b0.ray + 0x80) =
                             (uint)bVar11 * auVar74._0_4_ |
                             (uint)!bVar11 * *(int *)(local_5b0.ray + 0x80);
                        *(uint *)(local_5b0.ray + 0x84) =
                             (uint)bVar12 * auVar74._4_4_ |
                             (uint)!bVar12 * *(int *)(local_5b0.ray + 0x84);
                        *(uint *)(local_5b0.ray + 0x88) =
                             (uint)bVar13 * auVar74._8_4_ |
                             (uint)!bVar13 * *(int *)(local_5b0.ray + 0x88);
                        *(uint *)(local_5b0.ray + 0x8c) =
                             (uint)bVar14 * auVar74._12_4_ |
                             (uint)!bVar14 * *(int *)(local_5b0.ray + 0x8c);
                        if ((byte)uVar67 != 0) {
                          uVar60 = CONCAT71((int7)(uVar60 >> 8),1);
                          local_2c0 = auVar184._0_4_;
                          break;
                        }
                      }
                      auVar83 = auVar188._0_32_;
                      *(int *)(ray + k * 4 + 0x80) = auVar189._0_4_;
                      uVar60 = 0;
                      lVar64 = 0;
                      uVar61 = uVar61 ^ 1L << ((ulong)local_2c0 & 0x3f);
                      for (uVar67 = uVar61; (uVar67 & 1) == 0;
                          uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                        lVar64 = lVar64 + 1;
                      }
                      local_2c0 = auVar184._0_4_;
                    } while (uVar61 != 0);
                  }
                  goto LAB_01beef83;
                }
              }
            }
          }
          uVar60 = 0;
        }
      }
LAB_01beef83:
      if (8 < iVar7) {
        local_520 = vpbroadcastd_avx512vl();
        fStack_2d0 = 1.0 / (float)local_580._0_4_;
        local_2e0._4_4_ = fStack_2d0;
        local_2e0._0_4_ = fStack_2d0;
        fStack_2d8 = fStack_2d0;
        fStack_2d4 = fStack_2d0;
        local_580 = vpbroadcastd_avx512vl();
        local_570 = vpbroadcastd_avx512vl();
        lVar64 = 8;
        local_500 = auVar83;
        local_3a0 = uVar63;
        uStack_39c = uVar63;
        uStack_398 = uVar63;
        uStack_394 = uVar63;
        uStack_390 = uVar63;
        uStack_38c = uVar63;
        uStack_388 = uVar63;
        uStack_384 = uVar63;
        fStack_2cc = fStack_2d0;
        fStack_2c8 = fStack_2d0;
        fStack_2c4 = fStack_2d0;
        uStack_2bc = local_2c0;
        uStack_2b8 = local_2c0;
        uStack_2b4 = local_2c0;
        uStack_2b0 = local_2c0;
        uStack_2ac = local_2c0;
        uStack_2a8 = local_2c0;
        uStack_2a4 = local_2c0;
        do {
          auVar93 = vpbroadcastd_avx512vl();
          auVar78 = vpor_avx2(auVar93,_DAT_01fe9900);
          uVar23 = vpcmpd_avx512vl(auVar78,local_520,1);
          auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar64 * 4 + lVar24);
          auVar95 = *(undefined1 (*) [32])(lVar24 + 0x21aa768 + lVar64 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21aabec + lVar64 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar24 + 0x21ab070 + lVar64 * 4);
          local_420 = auVar191._0_32_;
          auVar79 = vmulps_avx512vl(local_420,auVar90);
          local_440 = auVar199._0_32_;
          auVar89 = vmulps_avx512vl(local_440,auVar90);
          auVar38._4_4_ = auVar90._4_4_ * (float)local_e0._4_4_;
          auVar38._0_4_ = auVar90._0_4_ * (float)local_e0._0_4_;
          auVar38._8_4_ = auVar90._8_4_ * fStack_d8;
          auVar38._12_4_ = auVar90._12_4_ * fStack_d4;
          auVar38._16_4_ = auVar90._16_4_ * fStack_d0;
          auVar38._20_4_ = auVar90._20_4_ * fStack_cc;
          auVar38._24_4_ = auVar90._24_4_ * fStack_c8;
          auVar38._28_4_ = auVar78._28_4_;
          auVar97 = auVar198._0_32_;
          auVar78 = vfmadd231ps_avx512vl(auVar79,auVar91,auVar97);
          auVar98 = auVar200._0_32_;
          auVar79 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar98);
          auVar89 = vfmadd231ps_avx512vl(auVar38,auVar91,local_c0);
          auVar96 = auVar196._0_32_;
          auVar78 = vfmadd231ps_avx512vl(auVar78,auVar95,auVar96);
          local_400 = auVar197._0_32_;
          auVar79 = vfmadd231ps_avx512vl(auVar79,auVar95,local_400);
          auVar74 = vfmadd231ps_fma(auVar89,auVar95,local_a0);
          auVar94 = auVar190._0_32_;
          auVar82 = vfmadd231ps_avx512vl(auVar78,auVar93,auVar94);
          local_3e0 = auVar195._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar79,auVar93,local_3e0);
          auVar78 = *(undefined1 (*) [32])(bezier_basis1 + lVar64 * 4 + lVar24);
          auVar79 = *(undefined1 (*) [32])(lVar24 + 0x21acb88 + lVar64 * 4);
          auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar93,local_80);
          auVar89 = *(undefined1 (*) [32])(lVar24 + 0x21ad00c + lVar64 * 4);
          auVar80 = *(undefined1 (*) [32])(lVar24 + 0x21ad490 + lVar64 * 4);
          auVar83 = vmulps_avx512vl(local_420,auVar80);
          auVar81 = vmulps_avx512vl(local_440,auVar80);
          auVar39._4_4_ = auVar80._4_4_ * (float)local_e0._4_4_;
          auVar39._0_4_ = auVar80._0_4_ * (float)local_e0._0_4_;
          auVar39._8_4_ = auVar80._8_4_ * fStack_d8;
          auVar39._12_4_ = auVar80._12_4_ * fStack_d4;
          auVar39._16_4_ = auVar80._16_4_ * fStack_d0;
          auVar39._20_4_ = auVar80._20_4_ * fStack_cc;
          auVar39._24_4_ = auVar80._24_4_ * fStack_c8;
          auVar39._28_4_ = uStack_c4;
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar89,auVar97);
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar89,auVar98);
          auVar85 = vfmadd231ps_avx512vl(auVar39,auVar89,local_c0);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar79,auVar96);
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar79,local_400);
          auVar73 = vfmadd231ps_fma(auVar85,auVar79,local_a0);
          auVar85 = vfmadd231ps_avx512vl(auVar83,auVar78,auVar94);
          auVar86 = vfmadd231ps_avx512vl(auVar81,auVar78,local_3e0);
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar78,local_80);
          auVar87 = vmaxps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar73));
          auVar83 = vsubps_avx(auVar85,auVar82);
          auVar81 = vsubps_avx(auVar86,auVar84);
          auVar88 = vmulps_avx512vl(auVar84,auVar83);
          auVar92 = vmulps_avx512vl(auVar82,auVar81);
          auVar88 = vsubps_avx512vl(auVar88,auVar92);
          auVar92 = vmulps_avx512vl(auVar81,auVar81);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar83,auVar83);
          auVar87 = vmulps_avx512vl(auVar87,auVar87);
          auVar87 = vmulps_avx512vl(auVar87,auVar92);
          auVar88 = vmulps_avx512vl(auVar88,auVar88);
          uVar136 = vcmpps_avx512vl(auVar88,auVar87,2);
          bVar66 = (byte)uVar23 & (byte)uVar136;
          if (bVar66 == 0) {
            auVar190 = ZEXT3264(auVar94);
          }
          else {
            auVar80 = vmulps_avx512vl(local_500,auVar80);
            auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar80);
            auVar79 = vfmadd213ps_avx512vl(auVar79,local_120,auVar89);
            auVar78 = vfmadd213ps_avx512vl(auVar78,local_100,auVar79);
            auVar90 = vmulps_avx512vl(local_500,auVar90);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar90);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_120,auVar91);
            auVar79 = vfmadd213ps_avx512vl(auVar93,local_100,auVar95);
            auVar93 = *(undefined1 (*) [32])(lVar24 + 0x21ab4f4 + lVar64 * 4);
            auVar95 = *(undefined1 (*) [32])(lVar24 + 0x21ab978 + lVar64 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21abdfc + lVar64 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar24 + 0x21ac280 + lVar64 * 4);
            auVar89 = vmulps_avx512vl(local_420,auVar90);
            auVar80 = vmulps_avx512vl(local_440,auVar90);
            auVar90 = vmulps_avx512vl(local_500,auVar90);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar97);
            auVar80 = vfmadd231ps_avx512vl(auVar80,auVar91,auVar98);
            auVar91 = vfmadd231ps_avx512vl(auVar90,local_140,auVar91);
            auVar90 = vfmadd231ps_avx512vl(auVar89,auVar95,auVar96);
            auVar89 = vfmadd231ps_avx512vl(auVar80,auVar95,local_400);
            auVar95 = vfmadd231ps_avx512vl(auVar91,local_120,auVar95);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar93,auVar94);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar93,local_3e0);
            auVar80 = vfmadd231ps_avx512vl(auVar95,local_100,auVar93);
            auVar93 = *(undefined1 (*) [32])(lVar24 + 0x21ad914 + lVar64 * 4);
            auVar95 = *(undefined1 (*) [32])(lVar24 + 0x21ae21c + lVar64 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21ae6a0 + lVar64 * 4);
            auVar87 = vmulps_avx512vl(local_420,auVar91);
            auVar88 = vmulps_avx512vl(local_440,auVar91);
            auVar91 = vmulps_avx512vl(local_500,auVar91);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar95,auVar97);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar95,auVar98);
            auVar91 = vfmadd231ps_avx512vl(auVar91,local_140,auVar95);
            auVar95 = *(undefined1 (*) [32])(lVar24 + 0x21add98 + lVar64 * 4);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar95,auVar96);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar95,local_400);
            auVar95 = vfmadd231ps_avx512vl(auVar91,local_120,auVar95);
            auVar91 = vfmadd231ps_avx512vl(auVar87,auVar93,auVar94);
            auVar87 = vfmadd231ps_avx512vl(auVar88,auVar93,local_3e0);
            auVar95 = vfmadd231ps_avx512vl(auVar95,local_100,auVar93);
            auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar90,auVar88);
            vandps_avx512vl(auVar89,auVar88);
            auVar93 = vmaxps_avx(auVar88,auVar88);
            vandps_avx512vl(auVar80,auVar88);
            auVar93 = vmaxps_avx(auVar93,auVar88);
            auVar57._4_4_ = uStack_2bc;
            auVar57._0_4_ = local_2c0;
            auVar57._8_4_ = uStack_2b8;
            auVar57._12_4_ = uStack_2b4;
            auVar57._16_4_ = uStack_2b0;
            auVar57._20_4_ = uStack_2ac;
            auVar57._24_4_ = uStack_2a8;
            auVar57._28_4_ = uStack_2a4;
            uVar67 = vcmpps_avx512vl(auVar93,auVar57,1);
            bVar11 = (bool)((byte)uVar67 & 1);
            auVar105._0_4_ = (float)((uint)bVar11 * auVar83._0_4_ | (uint)!bVar11 * auVar90._0_4_);
            bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar105._4_4_ = (float)((uint)bVar11 * auVar83._4_4_ | (uint)!bVar11 * auVar90._4_4_);
            bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar105._8_4_ = (float)((uint)bVar11 * auVar83._8_4_ | (uint)!bVar11 * auVar90._8_4_);
            bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar105._12_4_ =
                 (float)((uint)bVar11 * auVar83._12_4_ | (uint)!bVar11 * auVar90._12_4_);
            bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar105._16_4_ =
                 (float)((uint)bVar11 * auVar83._16_4_ | (uint)!bVar11 * auVar90._16_4_);
            bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar105._20_4_ =
                 (float)((uint)bVar11 * auVar83._20_4_ | (uint)!bVar11 * auVar90._20_4_);
            bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar105._24_4_ =
                 (float)((uint)bVar11 * auVar83._24_4_ | (uint)!bVar11 * auVar90._24_4_);
            bVar11 = SUB81(uVar67 >> 7,0);
            auVar105._28_4_ = (uint)bVar11 * auVar83._28_4_ | (uint)!bVar11 * auVar90._28_4_;
            bVar11 = (bool)((byte)uVar67 & 1);
            auVar106._0_4_ = (float)((uint)bVar11 * auVar81._0_4_ | (uint)!bVar11 * auVar89._0_4_);
            bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar106._4_4_ = (float)((uint)bVar11 * auVar81._4_4_ | (uint)!bVar11 * auVar89._4_4_);
            bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar106._8_4_ = (float)((uint)bVar11 * auVar81._8_4_ | (uint)!bVar11 * auVar89._8_4_);
            bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar106._12_4_ =
                 (float)((uint)bVar11 * auVar81._12_4_ | (uint)!bVar11 * auVar89._12_4_);
            bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar106._16_4_ =
                 (float)((uint)bVar11 * auVar81._16_4_ | (uint)!bVar11 * auVar89._16_4_);
            bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar106._20_4_ =
                 (float)((uint)bVar11 * auVar81._20_4_ | (uint)!bVar11 * auVar89._20_4_);
            bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar106._24_4_ =
                 (float)((uint)bVar11 * auVar81._24_4_ | (uint)!bVar11 * auVar89._24_4_);
            bVar11 = SUB81(uVar67 >> 7,0);
            auVar106._28_4_ = (uint)bVar11 * auVar81._28_4_ | (uint)!bVar11 * auVar89._28_4_;
            vandps_avx512vl(auVar91,auVar88);
            vandps_avx512vl(auVar87,auVar88);
            auVar93 = vmaxps_avx(auVar106,auVar106);
            vandps_avx512vl(auVar95,auVar88);
            auVar93 = vmaxps_avx(auVar93,auVar106);
            uVar67 = vcmpps_avx512vl(auVar93,auVar57,1);
            bVar11 = (bool)((byte)uVar67 & 1);
            auVar107._0_4_ = (uint)bVar11 * auVar83._0_4_ | (uint)!bVar11 * auVar91._0_4_;
            bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar107._4_4_ = (uint)bVar11 * auVar83._4_4_ | (uint)!bVar11 * auVar91._4_4_;
            bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar107._8_4_ = (uint)bVar11 * auVar83._8_4_ | (uint)!bVar11 * auVar91._8_4_;
            bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar107._12_4_ = (uint)bVar11 * auVar83._12_4_ | (uint)!bVar11 * auVar91._12_4_;
            bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar107._16_4_ = (uint)bVar11 * auVar83._16_4_ | (uint)!bVar11 * auVar91._16_4_;
            bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar107._20_4_ = (uint)bVar11 * auVar83._20_4_ | (uint)!bVar11 * auVar91._20_4_;
            bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar107._24_4_ = (uint)bVar11 * auVar83._24_4_ | (uint)!bVar11 * auVar91._24_4_;
            bVar11 = SUB81(uVar67 >> 7,0);
            auVar107._28_4_ = (uint)bVar11 * auVar83._28_4_ | (uint)!bVar11 * auVar91._28_4_;
            bVar11 = (bool)((byte)uVar67 & 1);
            auVar108._0_4_ = (float)((uint)bVar11 * auVar81._0_4_ | (uint)!bVar11 * auVar87._0_4_);
            bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar108._4_4_ = (float)((uint)bVar11 * auVar81._4_4_ | (uint)!bVar11 * auVar87._4_4_);
            bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar108._8_4_ = (float)((uint)bVar11 * auVar81._8_4_ | (uint)!bVar11 * auVar87._8_4_);
            bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar108._12_4_ =
                 (float)((uint)bVar11 * auVar81._12_4_ | (uint)!bVar11 * auVar87._12_4_);
            bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar108._16_4_ =
                 (float)((uint)bVar11 * auVar81._16_4_ | (uint)!bVar11 * auVar87._16_4_);
            bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar108._20_4_ =
                 (float)((uint)bVar11 * auVar81._20_4_ | (uint)!bVar11 * auVar87._20_4_);
            bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar108._24_4_ =
                 (float)((uint)bVar11 * auVar81._24_4_ | (uint)!bVar11 * auVar87._24_4_);
            bVar11 = SUB81(uVar67 >> 7,0);
            auVar108._28_4_ = (uint)bVar11 * auVar81._28_4_ | (uint)!bVar11 * auVar87._28_4_;
            auVar176._8_4_ = 0x80000000;
            auVar176._0_8_ = 0x8000000080000000;
            auVar176._12_4_ = 0x80000000;
            auVar176._16_4_ = 0x80000000;
            auVar176._20_4_ = 0x80000000;
            auVar176._24_4_ = 0x80000000;
            auVar176._28_4_ = 0x80000000;
            auVar93 = vxorps_avx512vl(auVar107,auVar176);
            auVar87 = auVar194._0_32_;
            auVar95 = vfmadd213ps_avx512vl(auVar105,auVar105,auVar87);
            auVar193 = vfmadd231ps_fma(auVar95,auVar106,auVar106);
            auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar193));
            auVar187._8_4_ = 0xbf000000;
            auVar187._0_8_ = 0xbf000000bf000000;
            auVar187._12_4_ = 0xbf000000;
            auVar187._16_4_ = 0xbf000000;
            auVar187._20_4_ = 0xbf000000;
            auVar187._24_4_ = 0xbf000000;
            auVar187._28_4_ = 0xbf000000;
            fVar148 = auVar95._0_4_;
            fVar133 = auVar95._4_4_;
            fVar134 = auVar95._8_4_;
            fVar135 = auVar95._12_4_;
            fVar166 = auVar95._16_4_;
            fVar169 = auVar95._20_4_;
            fVar68 = auVar95._24_4_;
            auVar40._4_4_ = fVar133 * fVar133 * fVar133 * auVar193._4_4_ * -0.5;
            auVar40._0_4_ = fVar148 * fVar148 * fVar148 * auVar193._0_4_ * -0.5;
            auVar40._8_4_ = fVar134 * fVar134 * fVar134 * auVar193._8_4_ * -0.5;
            auVar40._12_4_ = fVar135 * fVar135 * fVar135 * auVar193._12_4_ * -0.5;
            auVar40._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
            auVar40._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar40._24_4_ = fVar68 * fVar68 * fVar68 * -0.0;
            auVar40._28_4_ = auVar106._28_4_;
            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar95 = vfmadd231ps_avx512vl(auVar40,auVar91,auVar95);
            auVar41._4_4_ = auVar106._4_4_ * auVar95._4_4_;
            auVar41._0_4_ = auVar106._0_4_ * auVar95._0_4_;
            auVar41._8_4_ = auVar106._8_4_ * auVar95._8_4_;
            auVar41._12_4_ = auVar106._12_4_ * auVar95._12_4_;
            auVar41._16_4_ = auVar106._16_4_ * auVar95._16_4_;
            auVar41._20_4_ = auVar106._20_4_ * auVar95._20_4_;
            auVar41._24_4_ = auVar106._24_4_ * auVar95._24_4_;
            auVar41._28_4_ = 0;
            auVar42._4_4_ = auVar95._4_4_ * -auVar105._4_4_;
            auVar42._0_4_ = auVar95._0_4_ * -auVar105._0_4_;
            auVar42._8_4_ = auVar95._8_4_ * -auVar105._8_4_;
            auVar42._12_4_ = auVar95._12_4_ * -auVar105._12_4_;
            auVar42._16_4_ = auVar95._16_4_ * -auVar105._16_4_;
            auVar42._20_4_ = auVar95._20_4_ * -auVar105._20_4_;
            auVar42._24_4_ = auVar95._24_4_ * -auVar105._24_4_;
            auVar42._28_4_ = auVar106._28_4_;
            auVar90 = vmulps_avx512vl(auVar95,auVar87);
            auVar95 = vfmadd213ps_avx512vl(auVar107,auVar107,auVar87);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar108,auVar108);
            auVar89 = vrsqrt14ps_avx512vl(auVar95);
            auVar95 = vmulps_avx512vl(auVar95,auVar187);
            fVar148 = auVar89._0_4_;
            fVar133 = auVar89._4_4_;
            fVar134 = auVar89._8_4_;
            fVar135 = auVar89._12_4_;
            fVar166 = auVar89._16_4_;
            fVar169 = auVar89._20_4_;
            fVar68 = auVar89._24_4_;
            auVar43._4_4_ = fVar133 * fVar133 * fVar133 * auVar95._4_4_;
            auVar43._0_4_ = fVar148 * fVar148 * fVar148 * auVar95._0_4_;
            auVar43._8_4_ = fVar134 * fVar134 * fVar134 * auVar95._8_4_;
            auVar43._12_4_ = fVar135 * fVar135 * fVar135 * auVar95._12_4_;
            auVar43._16_4_ = fVar166 * fVar166 * fVar166 * auVar95._16_4_;
            auVar43._20_4_ = fVar169 * fVar169 * fVar169 * auVar95._20_4_;
            auVar43._24_4_ = fVar68 * fVar68 * fVar68 * auVar95._24_4_;
            auVar43._28_4_ = auVar95._28_4_;
            auVar95 = vfmadd231ps_avx512vl(auVar43,auVar91,auVar89);
            auVar44._4_4_ = auVar108._4_4_ * auVar95._4_4_;
            auVar44._0_4_ = auVar108._0_4_ * auVar95._0_4_;
            auVar44._8_4_ = auVar108._8_4_ * auVar95._8_4_;
            auVar44._12_4_ = auVar108._12_4_ * auVar95._12_4_;
            auVar44._16_4_ = auVar108._16_4_ * auVar95._16_4_;
            auVar44._20_4_ = auVar108._20_4_ * auVar95._20_4_;
            auVar44._24_4_ = auVar108._24_4_ * auVar95._24_4_;
            auVar44._28_4_ = auVar89._28_4_;
            auVar45._4_4_ = auVar95._4_4_ * auVar93._4_4_;
            auVar45._0_4_ = auVar95._0_4_ * auVar93._0_4_;
            auVar45._8_4_ = auVar95._8_4_ * auVar93._8_4_;
            auVar45._12_4_ = auVar95._12_4_ * auVar93._12_4_;
            auVar45._16_4_ = auVar95._16_4_ * auVar93._16_4_;
            auVar45._20_4_ = auVar95._20_4_ * auVar93._20_4_;
            auVar45._24_4_ = auVar95._24_4_ * auVar93._24_4_;
            auVar45._28_4_ = auVar93._28_4_;
            auVar93 = vmulps_avx512vl(auVar95,auVar87);
            auVar193 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar74),auVar82);
            auVar95 = ZEXT1632(auVar74);
            auVar17 = vfmadd213ps_fma(auVar42,auVar95,auVar84);
            auVar91 = vfmadd213ps_avx512vl(auVar90,auVar95,auVar79);
            auVar89 = vfmadd213ps_avx512vl(auVar44,ZEXT1632(auVar73),auVar85);
            auVar22 = vfnmadd213ps_fma(auVar41,auVar95,auVar82);
            auVar80 = ZEXT1632(auVar73);
            auVar18 = vfmadd213ps_fma(auVar45,auVar80,auVar86);
            auVar75 = vfnmadd213ps_fma(auVar42,auVar95,auVar84);
            auVar19 = vfmadd213ps_fma(auVar93,auVar80,auVar78);
            auVar84 = ZEXT1632(auVar74);
            auVar27 = vfnmadd231ps_fma(auVar79,auVar84,auVar90);
            auVar76 = vfnmadd213ps_fma(auVar44,auVar80,auVar85);
            auVar26 = vfnmadd213ps_fma(auVar45,auVar80,auVar86);
            auVar77 = vfnmadd231ps_fma(auVar78,ZEXT1632(auVar73),auVar93);
            auVar78 = vsubps_avx512vl(auVar89,ZEXT1632(auVar22));
            auVar93 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar75));
            auVar95 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar27));
            auVar46._4_4_ = auVar93._4_4_ * auVar27._4_4_;
            auVar46._0_4_ = auVar93._0_4_ * auVar27._0_4_;
            auVar46._8_4_ = auVar93._8_4_ * auVar27._8_4_;
            auVar46._12_4_ = auVar93._12_4_ * auVar27._12_4_;
            auVar46._16_4_ = auVar93._16_4_ * 0.0;
            auVar46._20_4_ = auVar93._20_4_ * 0.0;
            auVar46._24_4_ = auVar93._24_4_ * 0.0;
            auVar46._28_4_ = auVar90._28_4_;
            auVar74 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar75),auVar95);
            auVar47._4_4_ = auVar95._4_4_ * auVar22._4_4_;
            auVar47._0_4_ = auVar95._0_4_ * auVar22._0_4_;
            auVar47._8_4_ = auVar95._8_4_ * auVar22._8_4_;
            auVar47._12_4_ = auVar95._12_4_ * auVar22._12_4_;
            auVar47._16_4_ = auVar95._16_4_ * 0.0;
            auVar47._20_4_ = auVar95._20_4_ * 0.0;
            auVar47._24_4_ = auVar95._24_4_ * 0.0;
            auVar47._28_4_ = auVar95._28_4_;
            auVar20 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar27),auVar78);
            auVar48._4_4_ = auVar75._4_4_ * auVar78._4_4_;
            auVar48._0_4_ = auVar75._0_4_ * auVar78._0_4_;
            auVar48._8_4_ = auVar75._8_4_ * auVar78._8_4_;
            auVar48._12_4_ = auVar75._12_4_ * auVar78._12_4_;
            auVar48._16_4_ = auVar78._16_4_ * 0.0;
            auVar48._20_4_ = auVar78._20_4_ * 0.0;
            auVar48._24_4_ = auVar78._24_4_ * 0.0;
            auVar48._28_4_ = auVar78._28_4_;
            auVar21 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar22),auVar93);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar87,ZEXT1632(auVar20));
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar87,ZEXT1632(auVar74));
            uVar67 = vcmpps_avx512vl(auVar93,auVar87,2);
            bVar58 = (byte)uVar67;
            fVar116 = (float)((uint)(bVar58 & 1) * auVar193._0_4_ |
                             (uint)!(bool)(bVar58 & 1) * auVar76._0_4_);
            bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
            fVar118 = (float)((uint)bVar11 * auVar193._4_4_ | (uint)!bVar11 * auVar76._4_4_);
            bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
            fVar121 = (float)((uint)bVar11 * auVar193._8_4_ | (uint)!bVar11 * auVar76._8_4_);
            bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
            fVar122 = (float)((uint)bVar11 * auVar193._12_4_ | (uint)!bVar11 * auVar76._12_4_);
            auVar80 = ZEXT1632(CONCAT412(fVar122,CONCAT48(fVar121,CONCAT44(fVar118,fVar116))));
            fVar117 = (float)((uint)(bVar58 & 1) * auVar17._0_4_ |
                             (uint)!(bool)(bVar58 & 1) * auVar26._0_4_);
            bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
            fVar120 = (float)((uint)bVar11 * auVar17._4_4_ | (uint)!bVar11 * auVar26._4_4_);
            bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
            fVar119 = (float)((uint)bVar11 * auVar17._8_4_ | (uint)!bVar11 * auVar26._8_4_);
            bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
            fVar123 = (float)((uint)bVar11 * auVar17._12_4_ | (uint)!bVar11 * auVar26._12_4_);
            auVar83 = ZEXT1632(CONCAT412(fVar123,CONCAT48(fVar119,CONCAT44(fVar120,fVar117))));
            auVar109._0_4_ =
                 (float)((uint)(bVar58 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar77._0_4_);
            bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar109._4_4_ = (float)((uint)bVar11 * auVar91._4_4_ | (uint)!bVar11 * auVar77._4_4_);
            bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar109._8_4_ = (float)((uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * auVar77._8_4_);
            bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar109._12_4_ =
                 (float)((uint)bVar11 * auVar91._12_4_ | (uint)!bVar11 * auVar77._12_4_);
            fVar134 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar91._16_4_);
            auVar109._16_4_ = fVar134;
            fVar148 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar91._20_4_);
            auVar109._20_4_ = fVar148;
            fVar133 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar91._24_4_);
            auVar109._24_4_ = fVar133;
            iVar1 = (uint)(byte)(uVar67 >> 7) * auVar91._28_4_;
            auVar109._28_4_ = iVar1;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar22),auVar89);
            auVar110._0_4_ =
                 (uint)(bVar58 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar74._0_4_;
            bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar110._4_4_ = (uint)bVar11 * auVar93._4_4_ | (uint)!bVar11 * auVar74._4_4_;
            bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar110._8_4_ = (uint)bVar11 * auVar93._8_4_ | (uint)!bVar11 * auVar74._8_4_;
            bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar110._12_4_ = (uint)bVar11 * auVar93._12_4_ | (uint)!bVar11 * auVar74._12_4_;
            auVar110._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar93._16_4_;
            auVar110._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar93._20_4_;
            auVar110._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar93._24_4_;
            auVar110._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar18));
            auVar111._0_4_ =
                 (float)((uint)(bVar58 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar193._0_4_);
            bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar11 * auVar93._4_4_ | (uint)!bVar11 * auVar193._4_4_);
            bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar11 * auVar93._8_4_ | (uint)!bVar11 * auVar193._8_4_);
            bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar11 * auVar93._12_4_ | (uint)!bVar11 * auVar193._12_4_);
            fVar135 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar93._16_4_);
            auVar111._16_4_ = fVar135;
            fVar166 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar93._20_4_);
            auVar111._20_4_ = fVar166;
            fVar169 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar93._24_4_);
            auVar111._24_4_ = fVar169;
            auVar111._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar27),ZEXT1632(auVar19));
            auVar112._0_4_ =
                 (float)((uint)(bVar58 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar58 & 1) * auVar17._0_4_);
            bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar11 * auVar93._4_4_ | (uint)!bVar11 * auVar17._4_4_);
            bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar11 * auVar93._8_4_ | (uint)!bVar11 * auVar17._8_4_);
            bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar11 * auVar93._12_4_ | (uint)!bVar11 * auVar17._12_4_);
            fVar115 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar93._16_4_);
            auVar112._16_4_ = fVar115;
            fVar69 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar93._20_4_);
            auVar112._20_4_ = fVar69;
            fVar68 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar93._24_4_);
            auVar112._24_4_ = fVar68;
            iVar2 = (uint)(byte)(uVar67 >> 7) * auVar93._28_4_;
            auVar112._28_4_ = iVar2;
            auVar113._0_4_ =
                 (uint)(bVar58 & 1) * (int)auVar22._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar89._0_4_
            ;
            bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar113._4_4_ = (uint)bVar11 * (int)auVar22._4_4_ | (uint)!bVar11 * auVar89._4_4_;
            bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar113._8_4_ = (uint)bVar11 * (int)auVar22._8_4_ | (uint)!bVar11 * auVar89._8_4_;
            bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar113._12_4_ = (uint)bVar11 * (int)auVar22._12_4_ | (uint)!bVar11 * auVar89._12_4_;
            auVar113._16_4_ = (uint)!(bool)((byte)(uVar67 >> 4) & 1) * auVar89._16_4_;
            auVar113._20_4_ = (uint)!(bool)((byte)(uVar67 >> 5) & 1) * auVar89._20_4_;
            auVar113._24_4_ = (uint)!(bool)((byte)(uVar67 >> 6) & 1) * auVar89._24_4_;
            auVar113._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar89._28_4_;
            bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar67 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar89 = vsubps_avx512vl(auVar113,auVar80);
            auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar75._12_4_ |
                                                    (uint)!bVar15 * auVar18._12_4_,
                                                    CONCAT48((uint)bVar13 * (int)auVar75._8_4_ |
                                                             (uint)!bVar13 * auVar18._8_4_,
                                                             CONCAT44((uint)bVar11 *
                                                                      (int)auVar75._4_4_ |
                                                                      (uint)!bVar11 * auVar18._4_4_,
                                                                      (uint)(bVar58 & 1) *
                                                                      (int)auVar75._0_4_ |
                                                                      (uint)!(bool)(bVar58 & 1) *
                                                                      auVar18._0_4_)))),auVar83);
            auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar27._12_4_ |
                                                    (uint)!bVar16 * auVar19._12_4_,
                                                    CONCAT48((uint)bVar14 * (int)auVar27._8_4_ |
                                                             (uint)!bVar14 * auVar19._8_4_,
                                                             CONCAT44((uint)bVar12 *
                                                                      (int)auVar27._4_4_ |
                                                                      (uint)!bVar12 * auVar19._4_4_,
                                                                      (uint)(bVar58 & 1) *
                                                                      (int)auVar27._0_4_ |
                                                                      (uint)!(bool)(bVar58 & 1) *
                                                                      auVar19._0_4_)))),auVar109);
            auVar90 = vsubps_avx(auVar80,auVar110);
            auVar78 = vsubps_avx(auVar83,auVar111);
            auVar79 = vsubps_avx(auVar109,auVar112);
            auVar49._4_4_ = auVar91._4_4_ * fVar118;
            auVar49._0_4_ = auVar91._0_4_ * fVar116;
            auVar49._8_4_ = auVar91._8_4_ * fVar121;
            auVar49._12_4_ = auVar91._12_4_ * fVar122;
            auVar49._16_4_ = auVar91._16_4_ * 0.0;
            auVar49._20_4_ = auVar91._20_4_ * 0.0;
            auVar49._24_4_ = auVar91._24_4_ * 0.0;
            auVar49._28_4_ = 0;
            auVar74 = vfmsub231ps_fma(auVar49,auVar109,auVar89);
            auVar154._0_4_ = fVar117 * auVar89._0_4_;
            auVar154._4_4_ = fVar120 * auVar89._4_4_;
            auVar154._8_4_ = fVar119 * auVar89._8_4_;
            auVar154._12_4_ = fVar123 * auVar89._12_4_;
            auVar154._16_4_ = auVar89._16_4_ * 0.0;
            auVar154._20_4_ = auVar89._20_4_ * 0.0;
            auVar154._24_4_ = auVar89._24_4_ * 0.0;
            auVar154._28_4_ = 0;
            auVar193 = vfmsub231ps_fma(auVar154,auVar80,auVar95);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar193),auVar87,ZEXT1632(auVar74));
            auVar159._0_4_ = auVar95._0_4_ * auVar109._0_4_;
            auVar159._4_4_ = auVar95._4_4_ * auVar109._4_4_;
            auVar159._8_4_ = auVar95._8_4_ * auVar109._8_4_;
            auVar159._12_4_ = auVar95._12_4_ * auVar109._12_4_;
            auVar159._16_4_ = auVar95._16_4_ * fVar134;
            auVar159._20_4_ = auVar95._20_4_ * fVar148;
            auVar159._24_4_ = auVar95._24_4_ * fVar133;
            auVar159._28_4_ = 0;
            auVar74 = vfmsub231ps_fma(auVar159,auVar83,auVar91);
            auVar81 = vfmadd231ps_avx512vl(auVar93,auVar87,ZEXT1632(auVar74));
            auVar93 = vmulps_avx512vl(auVar79,auVar110);
            auVar93 = vfmsub231ps_avx512vl(auVar93,auVar90,auVar112);
            auVar50._4_4_ = auVar78._4_4_ * auVar112._4_4_;
            auVar50._0_4_ = auVar78._0_4_ * auVar112._0_4_;
            auVar50._8_4_ = auVar78._8_4_ * auVar112._8_4_;
            auVar50._12_4_ = auVar78._12_4_ * auVar112._12_4_;
            auVar50._16_4_ = auVar78._16_4_ * fVar115;
            auVar50._20_4_ = auVar78._20_4_ * fVar69;
            auVar50._24_4_ = auVar78._24_4_ * fVar68;
            auVar50._28_4_ = iVar2;
            auVar74 = vfmsub231ps_fma(auVar50,auVar111,auVar79);
            auVar160._0_4_ = auVar111._0_4_ * auVar90._0_4_;
            auVar160._4_4_ = auVar111._4_4_ * auVar90._4_4_;
            auVar160._8_4_ = auVar111._8_4_ * auVar90._8_4_;
            auVar160._12_4_ = auVar111._12_4_ * auVar90._12_4_;
            auVar160._16_4_ = fVar135 * auVar90._16_4_;
            auVar160._20_4_ = fVar166 * auVar90._20_4_;
            auVar160._24_4_ = fVar169 * auVar90._24_4_;
            auVar160._28_4_ = 0;
            auVar193 = vfmsub231ps_fma(auVar160,auVar78,auVar110);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar193),auVar87,auVar93);
            auVar82 = vfmadd231ps_avx512vl(auVar93,auVar87,ZEXT1632(auVar74));
            auVar93 = vmaxps_avx(auVar81,auVar82);
            uVar136 = vcmpps_avx512vl(auVar93,auVar87,2);
            bVar66 = bVar66 & (byte)uVar136;
            if (bVar66 != 0) {
              uVar124 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar183._4_4_ = uVar124;
              auVar183._0_4_ = uVar124;
              auVar183._8_4_ = uVar124;
              auVar183._12_4_ = uVar124;
              auVar183._16_4_ = uVar124;
              auVar183._20_4_ = uVar124;
              auVar183._24_4_ = uVar124;
              auVar183._28_4_ = uVar124;
              auVar184 = ZEXT3264(auVar183);
              auVar51._4_4_ = auVar79._4_4_ * auVar95._4_4_;
              auVar51._0_4_ = auVar79._0_4_ * auVar95._0_4_;
              auVar51._8_4_ = auVar79._8_4_ * auVar95._8_4_;
              auVar51._12_4_ = auVar79._12_4_ * auVar95._12_4_;
              auVar51._16_4_ = auVar79._16_4_ * auVar95._16_4_;
              auVar51._20_4_ = auVar79._20_4_ * auVar95._20_4_;
              auVar51._24_4_ = auVar79._24_4_ * auVar95._24_4_;
              auVar51._28_4_ = auVar93._28_4_;
              auVar17 = vfmsub231ps_fma(auVar51,auVar78,auVar91);
              auVar52._4_4_ = auVar91._4_4_ * auVar90._4_4_;
              auVar52._0_4_ = auVar91._0_4_ * auVar90._0_4_;
              auVar52._8_4_ = auVar91._8_4_ * auVar90._8_4_;
              auVar52._12_4_ = auVar91._12_4_ * auVar90._12_4_;
              auVar52._16_4_ = auVar91._16_4_ * auVar90._16_4_;
              auVar52._20_4_ = auVar91._20_4_ * auVar90._20_4_;
              auVar52._24_4_ = auVar91._24_4_ * auVar90._24_4_;
              auVar52._28_4_ = auVar91._28_4_;
              auVar193 = vfmsub231ps_fma(auVar52,auVar89,auVar79);
              auVar53._4_4_ = auVar78._4_4_ * auVar89._4_4_;
              auVar53._0_4_ = auVar78._0_4_ * auVar89._0_4_;
              auVar53._8_4_ = auVar78._8_4_ * auVar89._8_4_;
              auVar53._12_4_ = auVar78._12_4_ * auVar89._12_4_;
              auVar53._16_4_ = auVar78._16_4_ * auVar89._16_4_;
              auVar53._20_4_ = auVar78._20_4_ * auVar89._20_4_;
              auVar53._24_4_ = auVar78._24_4_ * auVar89._24_4_;
              auVar53._28_4_ = auVar78._28_4_;
              auVar18 = vfmsub231ps_fma(auVar53,auVar90,auVar95);
              auVar74 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar193),ZEXT1632(auVar18));
              auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar17),auVar87);
              auVar95 = vrcp14ps_avx512vl(auVar93);
              auVar90 = auVar192._0_32_;
              auVar91 = vfnmadd213ps_avx512vl(auVar95,auVar93,auVar90);
              auVar74 = vfmadd132ps_fma(auVar91,auVar95,auVar95);
              auVar54._4_4_ = auVar18._4_4_ * auVar109._4_4_;
              auVar54._0_4_ = auVar18._0_4_ * auVar109._0_4_;
              auVar54._8_4_ = auVar18._8_4_ * auVar109._8_4_;
              auVar54._12_4_ = auVar18._12_4_ * auVar109._12_4_;
              auVar54._16_4_ = fVar134 * 0.0;
              auVar54._20_4_ = fVar148 * 0.0;
              auVar54._24_4_ = fVar133 * 0.0;
              auVar54._28_4_ = iVar1;
              auVar193 = vfmadd231ps_fma(auVar54,auVar83,ZEXT1632(auVar193));
              auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar80,ZEXT1632(auVar17));
              fVar148 = auVar74._0_4_;
              fVar133 = auVar74._4_4_;
              fVar134 = auVar74._8_4_;
              fVar135 = auVar74._12_4_;
              local_240 = ZEXT1632(CONCAT412(auVar193._12_4_ * fVar135,
                                             CONCAT48(auVar193._8_4_ * fVar134,
                                                      CONCAT44(auVar193._4_4_ * fVar133,
                                                               auVar193._0_4_ * fVar148))));
              uVar136 = vcmpps_avx512vl(local_240,auVar183,2);
              auVar56._4_4_ = uStack_39c;
              auVar56._0_4_ = local_3a0;
              auVar56._8_4_ = uStack_398;
              auVar56._12_4_ = uStack_394;
              auVar56._16_4_ = uStack_390;
              auVar56._20_4_ = uStack_38c;
              auVar56._24_4_ = uStack_388;
              auVar56._28_4_ = uStack_384;
              uVar23 = vcmpps_avx512vl(local_240,auVar56,0xd);
              bVar66 = (byte)uVar136 & (byte)uVar23 & bVar66;
              if (bVar66 != 0) {
                uVar136 = vcmpps_avx512vl(auVar93,auVar87,4);
                bVar66 = bVar66 & (byte)uVar136;
                auVar190 = ZEXT3264(auVar94);
                if (bVar66 != 0) {
                  fVar166 = auVar81._0_4_ * fVar148;
                  fVar169 = auVar81._4_4_ * fVar133;
                  auVar55._4_4_ = fVar169;
                  auVar55._0_4_ = fVar166;
                  fVar68 = auVar81._8_4_ * fVar134;
                  auVar55._8_4_ = fVar68;
                  fVar69 = auVar81._12_4_ * fVar135;
                  auVar55._12_4_ = fVar69;
                  fVar115 = auVar81._16_4_ * 0.0;
                  auVar55._16_4_ = fVar115;
                  fVar116 = auVar81._20_4_ * 0.0;
                  auVar55._20_4_ = fVar116;
                  fVar117 = auVar81._24_4_ * 0.0;
                  auVar55._24_4_ = fVar117;
                  auVar55._28_4_ = auVar93._28_4_;
                  auVar95 = vsubps_avx512vl(auVar90,auVar55);
                  local_280._0_4_ =
                       (float)((uint)(bVar58 & 1) * (int)fVar166 |
                              (uint)!(bool)(bVar58 & 1) * auVar95._0_4_);
                  bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
                  local_280._4_4_ =
                       (float)((uint)bVar11 * (int)fVar169 | (uint)!bVar11 * auVar95._4_4_);
                  bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
                  local_280._8_4_ =
                       (float)((uint)bVar11 * (int)fVar68 | (uint)!bVar11 * auVar95._8_4_);
                  bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
                  local_280._12_4_ =
                       (float)((uint)bVar11 * (int)fVar69 | (uint)!bVar11 * auVar95._12_4_);
                  bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
                  local_280._16_4_ =
                       (float)((uint)bVar11 * (int)fVar115 | (uint)!bVar11 * auVar95._16_4_);
                  bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
                  local_280._20_4_ =
                       (float)((uint)bVar11 * (int)fVar116 | (uint)!bVar11 * auVar95._20_4_);
                  bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
                  local_280._24_4_ =
                       (float)((uint)bVar11 * (int)fVar117 | (uint)!bVar11 * auVar95._24_4_);
                  bVar11 = SUB81(uVar67 >> 7,0);
                  local_280._28_4_ =
                       (float)((uint)bVar11 * auVar93._28_4_ | (uint)!bVar11 * auVar95._28_4_);
                  auVar93 = vsubps_avx(ZEXT1632(auVar73),auVar84);
                  auVar74 = vfmadd213ps_fma(auVar93,local_280,auVar84);
                  uVar124 = *(undefined4 *)((long)local_5b8->ray_space + k * 4 + -0x10);
                  auVar31._4_4_ = uVar124;
                  auVar31._0_4_ = uVar124;
                  auVar31._8_4_ = uVar124;
                  auVar31._12_4_ = uVar124;
                  auVar31._16_4_ = uVar124;
                  auVar31._20_4_ = uVar124;
                  auVar31._24_4_ = uVar124;
                  auVar31._28_4_ = uVar124;
                  auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar74._12_4_ + auVar74._12_4_,
                                                               CONCAT48(auVar74._8_4_ +
                                                                        auVar74._8_4_,
                                                                        CONCAT44(auVar74._4_4_ +
                                                                                 auVar74._4_4_,
                                                                                 auVar74._0_4_ +
                                                                                 auVar74._0_4_)))),
                                            auVar31);
                  uVar136 = vcmpps_avx512vl(local_240,auVar93,6);
                  if (((byte)uVar136 & bVar66) != 0) {
                    auVar142._0_4_ = auVar82._0_4_ * fVar148;
                    auVar142._4_4_ = auVar82._4_4_ * fVar133;
                    auVar142._8_4_ = auVar82._8_4_ * fVar134;
                    auVar142._12_4_ = auVar82._12_4_ * fVar135;
                    auVar142._16_4_ = auVar82._16_4_ * 0.0;
                    auVar142._20_4_ = auVar82._20_4_ * 0.0;
                    auVar142._24_4_ = auVar82._24_4_ * 0.0;
                    auVar142._28_4_ = 0;
                    auVar93 = vsubps_avx512vl(auVar90,auVar142);
                    auVar114._0_4_ =
                         (uint)(bVar58 & 1) * (int)auVar142._0_4_ |
                         (uint)!(bool)(bVar58 & 1) * auVar93._0_4_;
                    bVar11 = (bool)((byte)(uVar67 >> 1) & 1);
                    auVar114._4_4_ =
                         (uint)bVar11 * (int)auVar142._4_4_ | (uint)!bVar11 * auVar93._4_4_;
                    bVar11 = (bool)((byte)(uVar67 >> 2) & 1);
                    auVar114._8_4_ =
                         (uint)bVar11 * (int)auVar142._8_4_ | (uint)!bVar11 * auVar93._8_4_;
                    bVar11 = (bool)((byte)(uVar67 >> 3) & 1);
                    auVar114._12_4_ =
                         (uint)bVar11 * (int)auVar142._12_4_ | (uint)!bVar11 * auVar93._12_4_;
                    bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
                    auVar114._16_4_ =
                         (uint)bVar11 * (int)auVar142._16_4_ | (uint)!bVar11 * auVar93._16_4_;
                    bVar11 = (bool)((byte)(uVar67 >> 5) & 1);
                    auVar114._20_4_ =
                         (uint)bVar11 * (int)auVar142._20_4_ | (uint)!bVar11 * auVar93._20_4_;
                    bVar11 = (bool)((byte)(uVar67 >> 6) & 1);
                    auVar114._24_4_ =
                         (uint)bVar11 * (int)auVar142._24_4_ | (uint)!bVar11 * auVar93._24_4_;
                    auVar114._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar93._28_4_;
                    auVar32._8_4_ = 0x40000000;
                    auVar32._0_8_ = 0x4000000040000000;
                    auVar32._12_4_ = 0x40000000;
                    auVar32._16_4_ = 0x40000000;
                    auVar32._20_4_ = 0x40000000;
                    auVar32._24_4_ = 0x40000000;
                    auVar32._28_4_ = 0x40000000;
                    local_260 = vfmsub132ps_avx512vl(auVar114,auVar90,auVar32);
                    local_220 = (undefined4)lVar64;
                    local_210 = local_540._0_8_;
                    uStack_208 = local_540._8_8_;
                    local_200 = local_550._0_8_;
                    uStack_1f8 = local_550._8_8_;
                    local_1f0 = local_560._0_8_;
                    uStack_1e8 = local_560._8_8_;
                    pGVar62 = (context->scene->geometries).items[local_5e8].ptr;
                    if ((pGVar62->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      bVar58 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar58 = 1, pGVar62->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar74 = vcvtsi2ss_avx512f(auVar88._0_16_,local_220);
                      fVar148 = auVar74._0_4_;
                      local_1c0[0] = (fVar148 + local_280._0_4_ + 0.0) * (float)local_2e0._0_4_;
                      local_1c0[1] = (fVar148 + local_280._4_4_ + 1.0) * (float)local_2e0._4_4_;
                      local_1c0[2] = (fVar148 + local_280._8_4_ + 2.0) * fStack_2d8;
                      local_1c0[3] = (fVar148 + local_280._12_4_ + 3.0) * fStack_2d4;
                      fStack_1b0 = (fVar148 + local_280._16_4_ + 4.0) * fStack_2d0;
                      fStack_1ac = (fVar148 + local_280._20_4_ + 5.0) * fStack_2cc;
                      fStack_1a8 = (fVar148 + local_280._24_4_ + 6.0) * fStack_2c8;
                      fStack_1a4 = fVar148 + local_280._28_4_ + 7.0;
                      local_1a0 = local_260;
                      local_180 = local_240;
                      uVar67 = CONCAT71(0,(byte)uVar136 & bVar66);
                      local_5e0._0_8_ = uVar67;
                      lVar9 = 0;
                      for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                        lVar9 = lVar9 + 1;
                      }
                      local_5d0._0_8_ = lVar9;
                      local_460._0_4_ = (int)uVar60;
                      local_160 = auVar183;
                      local_5c0 = pGVar62;
                      local_21c = iVar7;
                      do {
                        auVar193 = auVar194._0_16_;
                        local_340 = local_1c0[local_5d0._0_8_];
                        local_330 = *(undefined4 *)(local_1a0 + local_5d0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_180 + local_5d0._0_8_ * 4);
                        local_5b0.context = context->user;
                        fVar133 = 1.0 - local_340;
                        fVar148 = fVar133 * fVar133 * -3.0;
                        auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133)),
                                                  ZEXT416((uint)(local_340 * fVar133)),
                                                  ZEXT416(0xc0000000));
                        auVar73 = vfmsub132ss_fma(ZEXT416((uint)(local_340 * fVar133)),
                                                  ZEXT416((uint)(local_340 * local_340)),
                                                  ZEXT416(0x40000000));
                        fVar133 = auVar74._0_4_ * 3.0;
                        fVar134 = auVar73._0_4_ * 3.0;
                        fVar135 = local_340 * local_340 * 3.0;
                        auVar165._0_4_ = fVar135 * (float)local_3b0._0_4_;
                        auVar165._4_4_ = fVar135 * (float)local_3b0._4_4_;
                        auVar165._8_4_ = fVar135 * fStack_3a8;
                        auVar165._12_4_ = fVar135 * fStack_3a4;
                        auVar131._4_4_ = fVar134;
                        auVar131._0_4_ = fVar134;
                        auVar131._8_4_ = fVar134;
                        auVar131._12_4_ = fVar134;
                        auVar74 = vfmadd132ps_fma(auVar131,auVar165,local_560);
                        auVar152._4_4_ = fVar133;
                        auVar152._0_4_ = fVar133;
                        auVar152._8_4_ = fVar133;
                        auVar152._12_4_ = fVar133;
                        auVar74 = vfmadd132ps_fma(auVar152,auVar74,local_550);
                        auVar132._4_4_ = fVar148;
                        auVar132._0_4_ = fVar148;
                        auVar132._8_4_ = fVar148;
                        auVar132._12_4_ = fVar148;
                        auVar74 = vfmadd132ps_fma(auVar132,auVar74,local_540);
                        local_370 = auVar74._0_4_;
                        local_360 = vshufps_avx(auVar74,auVar74,0x55);
                        local_350 = vshufps_avx(auVar74,auVar74,0xaa);
                        local_320 = local_570._0_8_;
                        uStack_318 = local_570._8_8_;
                        local_310 = local_580;
                        vpcmpeqd_avx2(ZEXT1632(local_580),ZEXT1632(local_580));
                        uStack_2fc = (local_5b0.context)->instID[0];
                        local_300 = uStack_2fc;
                        uStack_2f8 = uStack_2fc;
                        uStack_2f4 = uStack_2fc;
                        uStack_2f0 = (local_5b0.context)->instPrimID[0];
                        uStack_2ec = uStack_2f0;
                        uStack_2e8 = uStack_2f0;
                        uStack_2e4 = uStack_2f0;
                        local_600 = local_3c0;
                        local_5b0.valid = (int *)local_600;
                        local_5b0.geometryUserPtr = pGVar62->userPtr;
                        local_5b0.hit = (RTCHitN *)&local_370;
                        local_5b0.N = 4;
                        local_5b0.ray = (RTCRayN *)ray;
                        uStack_36c = local_370;
                        uStack_368 = local_370;
                        uStack_364 = local_370;
                        fStack_33c = local_340;
                        fStack_338 = local_340;
                        fStack_334 = local_340;
                        uStack_32c = local_330;
                        uStack_328 = local_330;
                        uStack_324 = local_330;
                        if (pGVar62->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar62->occlusionFilterN)(&local_5b0);
                          auVar184 = ZEXT3264(local_160);
                          uVar60 = (ulong)(uint)local_460._0_4_;
                          auVar199 = ZEXT3264(local_440);
                          auVar191 = ZEXT3264(local_420);
                          auVar200 = ZEXT3264(local_4e0);
                          auVar198 = ZEXT3264(local_4c0);
                          auVar197 = ZEXT3264(local_400);
                          auVar196 = ZEXT3264(local_4a0);
                          auVar195 = ZEXT3264(local_3e0);
                          auVar190 = ZEXT3264(local_480);
                          auVar74 = vxorps_avx512vl(auVar193,auVar193);
                          auVar194 = ZEXT1664(auVar74);
                          pGVar62 = local_5c0;
                        }
                        auVar74 = auVar194._0_16_;
                        uVar67 = vptestmd_avx512vl(local_600,local_600);
                        if ((uVar67 & 0xf) == 0) {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar192 = ZEXT3264(auVar93);
                        }
                        else {
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar62->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var10)(&local_5b0);
                            auVar184 = ZEXT3264(local_160);
                            uVar60 = (ulong)(uint)local_460._0_4_;
                            auVar199 = ZEXT3264(local_440);
                            auVar191 = ZEXT3264(local_420);
                            auVar200 = ZEXT3264(local_4e0);
                            auVar198 = ZEXT3264(local_4c0);
                            auVar197 = ZEXT3264(local_400);
                            auVar196 = ZEXT3264(local_4a0);
                            auVar195 = ZEXT3264(local_3e0);
                            auVar190 = ZEXT3264(local_480);
                            auVar74 = vxorps_avx512vl(auVar74,auVar74);
                            auVar194 = ZEXT1664(auVar74);
                            pGVar62 = local_5c0;
                          }
                          uVar67 = vptestmd_avx512vl(local_600,local_600);
                          uVar67 = uVar67 & 0xf;
                          auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar11 = (bool)((byte)uVar67 & 1);
                          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                          bVar14 = SUB81(uVar67 >> 3,0);
                          *(uint *)(local_5b0.ray + 0x80) =
                               (uint)bVar11 * auVar74._0_4_ |
                               (uint)!bVar11 * *(int *)(local_5b0.ray + 0x80);
                          *(uint *)(local_5b0.ray + 0x84) =
                               (uint)bVar12 * auVar74._4_4_ |
                               (uint)!bVar12 * *(int *)(local_5b0.ray + 0x84);
                          *(uint *)(local_5b0.ray + 0x88) =
                               (uint)bVar13 * auVar74._8_4_ |
                               (uint)!bVar13 * *(int *)(local_5b0.ray + 0x88);
                          *(uint *)(local_5b0.ray + 0x8c) =
                               (uint)bVar14 * auVar74._12_4_ |
                               (uint)!bVar14 * *(int *)(local_5b0.ray + 0x8c);
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar192 = ZEXT3264(auVar93);
                          if ((byte)uVar67 != 0) {
                            bVar58 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x80) = auVar184._0_4_;
                        local_5e0._0_8_ = local_5e0._0_8_ ^ 1L << (local_5d0._0_8_ & 0x3f);
                        bVar58 = 0;
                        lVar9 = 0;
                        for (uVar67 = local_5e0._0_8_; (uVar67 & 1) == 0;
                            uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                          lVar9 = lVar9 + 1;
                        }
                        local_5d0._0_8_ = lVar9;
                      } while (local_5e0._0_8_ != 0);
                    }
                    uVar60 = CONCAT71((int7)(uVar60 >> 8),(byte)uVar60 | bVar58);
                  }
                }
                goto LAB_01befac0;
              }
            }
            auVar190 = ZEXT3264(auVar94);
          }
LAB_01befac0:
          lVar64 = lVar64 + 8;
        } while ((int)lVar64 < iVar7);
      }
      bVar66 = (byte)uVar60;
      if ((uVar60 & 1) != 0) break;
      uVar124 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar29._4_4_ = uVar124;
      auVar29._0_4_ = uVar124;
      auVar29._8_4_ = uVar124;
      auVar29._12_4_ = uVar124;
      uVar136 = vcmpps_avx512vl(local_290,auVar29,2);
      uVar63 = (uint)uVar65 & (uint)uVar65 + 0xf & (uint)uVar136;
      uVar65 = (ulong)uVar63;
    } while (uVar63 != 0);
  }
  return (bool)(bVar66 & 1);
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }